

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  uint uVar75;
  uint uVar76;
  long lVar77;
  ulong uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  uint uVar82;
  bool bVar83;
  float fVar84;
  float fVar116;
  float fVar118;
  __m128 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar86 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar120;
  undefined1 auVar99 [32];
  float fVar85;
  undefined1 auVar100 [32];
  float fVar117;
  float fVar119;
  float fVar121;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar125;
  float fVar154;
  float fVar155;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar156;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar175;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar176;
  undefined1 auVar167 [32];
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar183;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar162 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar233;
  float fVar235;
  undefined1 auVar219 [32];
  float fVar230;
  float fVar232;
  float fVar234;
  float fVar236;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar237;
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [28];
  float fVar258;
  float fVar260;
  float fVar264;
  float fVar266;
  undefined1 auVar246 [32];
  float fVar262;
  float fVar268;
  undefined1 auVar247 [32];
  float fVar259;
  float fVar261;
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar270;
  float fVar286;
  float fVar290;
  undefined1 auVar274 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [28];
  float fVar298;
  float fVar302;
  undefined1 auVar279 [32];
  float fVar294;
  float fVar306;
  undefined1 auVar280 [32];
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar296;
  float fVar299;
  float fVar300;
  float fVar303;
  float fVar304;
  float fVar307;
  float fVar308;
  float fVar310;
  undefined1 auVar281 [32];
  float fVar289;
  float fVar293;
  float fVar297;
  float fVar301;
  float fVar305;
  float fVar309;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [16];
  float fVar328;
  float fVar329;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar335;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  float fVar346;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  undefined1 auVar361 [16];
  float fVar360;
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar371;
  float in_register_0000151c;
  undefined1 auVar362 [32];
  float fVar368;
  float fVar372;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar373;
  float fVar374;
  undefined1 auVar375 [16];
  float fVar378;
  float fVar380;
  float fVar384;
  float fVar386;
  float fVar388;
  undefined1 auVar376 [32];
  float fVar379;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar385;
  float fVar387;
  float fVar389;
  float fVar390;
  undefined1 auVar377 [32];
  undefined1 auVar391 [16];
  undefined1 auVar392 [32];
  float in_register_0000159c;
  undefined1 auVar393 [64];
  undefined1 auVar394 [28];
  float fVar396;
  float in_register_000015dc;
  undefined1 auVar395 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d64;
  undefined1 local_d20 [8];
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c10 [8];
  float fStack_c08;
  float fStack_c04;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  undefined1 local_bf0 [8];
  float fStack_be8;
  float fStack_be4;
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 (*local_b18) [16];
  undefined1 (*local_b10) [16];
  undefined1 (*local_b08) [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  Primitive *local_970;
  Primitive *local_968;
  uint local_960;
  undefined1 auStack_95c [28];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  uint uStack_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar5 = prim[1];
  uVar81 = (ulong)(byte)PVar5;
  local_970 = prim + uVar81 * 0x19 + 0x16;
  auVar128 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar128 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar207 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar128 = vsubps_avx(auVar128,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar126._0_4_ = fVar207 * auVar128._0_4_;
  auVar126._4_4_ = fVar207 * auVar128._4_4_;
  auVar126._8_4_ = fVar207 * auVar128._8_4_;
  auVar126._12_4_ = fVar207 * auVar128._12_4_;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 10)));
  auVar274._0_4_ = fVar207 * auVar16._0_4_;
  auVar274._4_4_ = fVar207 * auVar16._4_4_;
  auVar274._8_4_ = fVar207 * auVar16._8_4_;
  auVar274._12_4_ = fVar207 * auVar16._12_4_;
  auVar94._16_16_ = auVar19;
  auVar94._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 10)));
  auVar163._16_16_ = auVar16;
  auVar163._0_16_ = auVar128;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar163);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 10)));
  auVar199._16_16_ = auVar16;
  auVar199._0_16_ = auVar128;
  auVar10 = vcvtdq2ps_avx(auVar199);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 10)));
  auVar200._16_16_ = auVar16;
  auVar200._0_16_ = auVar128;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 10)));
  auVar11 = vcvtdq2ps_avx(auVar200);
  auVar246._16_16_ = auVar16;
  auVar246._0_16_ = auVar128;
  auVar12 = vcvtdq2ps_avx(auVar246);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 10)));
  auVar312._16_16_ = auVar16;
  auVar312._0_16_ = auVar128;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar312);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 10)));
  auVar313._16_16_ = auVar16;
  auVar313._0_16_ = auVar128;
  auVar14 = vcvtdq2ps_avx(auVar313);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 10)));
  auVar330._16_16_ = auVar16;
  auVar330._0_16_ = auVar128;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 10)));
  auVar15 = vcvtdq2ps_avx(auVar330);
  auVar336._16_16_ = auVar16;
  auVar336._0_16_ = auVar128;
  auVar221 = vcvtdq2ps_avx(auVar336);
  auVar128 = vshufps_avx(auVar274,auVar274,0);
  auVar16 = vshufps_avx(auVar274,auVar274,0x55);
  auVar19 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar207 = auVar19._0_4_;
  fVar227 = auVar19._4_4_;
  fVar228 = auVar19._8_4_;
  fVar229 = auVar19._12_4_;
  fVar231 = auVar16._0_4_;
  fVar233 = auVar16._4_4_;
  fVar235 = auVar16._8_4_;
  fVar270 = auVar16._12_4_;
  fVar286 = auVar128._0_4_;
  fVar290 = auVar128._4_4_;
  fVar294 = auVar128._8_4_;
  fVar298 = auVar128._12_4_;
  auVar362._0_4_ = fVar286 * auVar94._0_4_ + fVar231 * auVar106._0_4_ + fVar207 * auVar10._0_4_;
  auVar362._4_4_ = fVar290 * auVar94._4_4_ + fVar233 * auVar106._4_4_ + fVar227 * auVar10._4_4_;
  auVar362._8_4_ = fVar294 * auVar94._8_4_ + fVar235 * auVar106._8_4_ + fVar228 * auVar10._8_4_;
  auVar362._12_4_ = fVar298 * auVar94._12_4_ + fVar270 * auVar106._12_4_ + fVar229 * auVar10._12_4_;
  auVar362._16_4_ = fVar286 * auVar94._16_4_ + fVar231 * auVar106._16_4_ + fVar207 * auVar10._16_4_;
  auVar362._20_4_ = fVar290 * auVar94._20_4_ + fVar233 * auVar106._20_4_ + fVar227 * auVar10._20_4_;
  auVar362._24_4_ = fVar294 * auVar94._24_4_ + fVar235 * auVar106._24_4_ + fVar228 * auVar10._24_4_;
  auVar362._28_4_ = fVar270 + in_register_000015dc + in_register_0000151c;
  auVar347._0_4_ = fVar286 * auVar11._0_4_ + fVar231 * auVar12._0_4_ + auVar13._0_4_ * fVar207;
  auVar347._4_4_ = fVar290 * auVar11._4_4_ + fVar233 * auVar12._4_4_ + auVar13._4_4_ * fVar227;
  auVar347._8_4_ = fVar294 * auVar11._8_4_ + fVar235 * auVar12._8_4_ + auVar13._8_4_ * fVar228;
  auVar347._12_4_ = fVar298 * auVar11._12_4_ + fVar270 * auVar12._12_4_ + auVar13._12_4_ * fVar229;
  auVar347._16_4_ = fVar286 * auVar11._16_4_ + fVar231 * auVar12._16_4_ + auVar13._16_4_ * fVar207;
  auVar347._20_4_ = fVar290 * auVar11._20_4_ + fVar233 * auVar12._20_4_ + auVar13._20_4_ * fVar227;
  auVar347._24_4_ = fVar294 * auVar11._24_4_ + fVar235 * auVar12._24_4_ + auVar13._24_4_ * fVar228;
  auVar347._28_4_ = fVar270 + in_register_000015dc + in_register_0000159c;
  auVar279._0_4_ = fVar286 * auVar14._0_4_ + fVar231 * auVar15._0_4_ + auVar221._0_4_ * fVar207;
  auVar279._4_4_ = fVar290 * auVar14._4_4_ + fVar233 * auVar15._4_4_ + auVar221._4_4_ * fVar227;
  auVar279._8_4_ = fVar294 * auVar14._8_4_ + fVar235 * auVar15._8_4_ + auVar221._8_4_ * fVar228;
  auVar279._12_4_ = fVar298 * auVar14._12_4_ + fVar270 * auVar15._12_4_ + auVar221._12_4_ * fVar229;
  auVar279._16_4_ = fVar286 * auVar14._16_4_ + fVar231 * auVar15._16_4_ + auVar221._16_4_ * fVar207;
  auVar279._20_4_ = fVar290 * auVar14._20_4_ + fVar233 * auVar15._20_4_ + auVar221._20_4_ * fVar227;
  auVar279._24_4_ = fVar294 * auVar14._24_4_ + fVar235 * auVar15._24_4_ + auVar221._24_4_ * fVar228;
  auVar279._28_4_ = fVar298 + fVar270 + fVar229;
  auVar128 = vshufps_avx(auVar126,auVar126,0);
  auVar16 = vshufps_avx(auVar126,auVar126,0x55);
  auVar19 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar227 = auVar19._0_4_;
  fVar228 = auVar19._4_4_;
  fVar229 = auVar19._8_4_;
  fVar231 = auVar19._12_4_;
  fVar290 = auVar16._0_4_;
  fVar294 = auVar16._4_4_;
  fVar298 = auVar16._8_4_;
  fVar302 = auVar16._12_4_;
  fVar233 = auVar128._0_4_;
  fVar235 = auVar128._4_4_;
  fVar270 = auVar128._8_4_;
  fVar286 = auVar128._12_4_;
  fVar207 = auVar94._28_4_;
  auVar140._0_4_ = fVar233 * auVar94._0_4_ + fVar290 * auVar106._0_4_ + fVar227 * auVar10._0_4_;
  auVar140._4_4_ = fVar235 * auVar94._4_4_ + fVar294 * auVar106._4_4_ + fVar228 * auVar10._4_4_;
  auVar140._8_4_ = fVar270 * auVar94._8_4_ + fVar298 * auVar106._8_4_ + fVar229 * auVar10._8_4_;
  auVar140._12_4_ = fVar286 * auVar94._12_4_ + fVar302 * auVar106._12_4_ + fVar231 * auVar10._12_4_;
  auVar140._16_4_ = fVar233 * auVar94._16_4_ + fVar290 * auVar106._16_4_ + fVar227 * auVar10._16_4_;
  auVar140._20_4_ = fVar235 * auVar94._20_4_ + fVar294 * auVar106._20_4_ + fVar228 * auVar10._20_4_;
  auVar140._24_4_ = fVar270 * auVar94._24_4_ + fVar298 * auVar106._24_4_ + fVar229 * auVar10._24_4_;
  auVar140._28_4_ = fVar207 + auVar106._28_4_ + auVar10._28_4_;
  auVar164._0_4_ = fVar233 * auVar11._0_4_ + auVar13._0_4_ * fVar227 + fVar290 * auVar12._0_4_;
  auVar164._4_4_ = fVar235 * auVar11._4_4_ + auVar13._4_4_ * fVar228 + fVar294 * auVar12._4_4_;
  auVar164._8_4_ = fVar270 * auVar11._8_4_ + auVar13._8_4_ * fVar229 + fVar298 * auVar12._8_4_;
  auVar164._12_4_ = fVar286 * auVar11._12_4_ + auVar13._12_4_ * fVar231 + fVar302 * auVar12._12_4_;
  auVar164._16_4_ = fVar233 * auVar11._16_4_ + auVar13._16_4_ * fVar227 + fVar290 * auVar12._16_4_;
  auVar164._20_4_ = fVar235 * auVar11._20_4_ + auVar13._20_4_ * fVar228 + fVar294 * auVar12._20_4_;
  auVar164._24_4_ = fVar270 * auVar11._24_4_ + auVar13._24_4_ * fVar229 + fVar298 * auVar12._24_4_;
  auVar164._28_4_ = fVar207 + auVar13._28_4_ + auVar10._28_4_;
  auVar322._8_4_ = 0x7fffffff;
  auVar322._0_8_ = 0x7fffffff7fffffff;
  auVar322._12_4_ = 0x7fffffff;
  auVar322._16_4_ = 0x7fffffff;
  auVar322._20_4_ = 0x7fffffff;
  auVar322._24_4_ = 0x7fffffff;
  auVar322._28_4_ = 0x7fffffff;
  auVar331._8_4_ = 0x219392ef;
  auVar331._0_8_ = 0x219392ef219392ef;
  auVar331._12_4_ = 0x219392ef;
  auVar331._16_4_ = 0x219392ef;
  auVar331._20_4_ = 0x219392ef;
  auVar331._24_4_ = 0x219392ef;
  auVar331._28_4_ = 0x219392ef;
  auVar94 = vandps_avx(auVar362,auVar322);
  auVar94 = vcmpps_avx(auVar94,auVar331,1);
  auVar106 = vblendvps_avx(auVar362,auVar331,auVar94);
  auVar94 = vandps_avx(auVar347,auVar322);
  auVar94 = vcmpps_avx(auVar94,auVar331,1);
  auVar10 = vblendvps_avx(auVar347,auVar331,auVar94);
  auVar94 = vandps_avx(auVar322,auVar279);
  auVar94 = vcmpps_avx(auVar94,auVar331,1);
  auVar94 = vblendvps_avx(auVar279,auVar331,auVar94);
  auVar201._0_4_ = fVar233 * auVar14._0_4_ + fVar290 * auVar15._0_4_ + auVar221._0_4_ * fVar227;
  auVar201._4_4_ = fVar235 * auVar14._4_4_ + fVar294 * auVar15._4_4_ + auVar221._4_4_ * fVar228;
  auVar201._8_4_ = fVar270 * auVar14._8_4_ + fVar298 * auVar15._8_4_ + auVar221._8_4_ * fVar229;
  auVar201._12_4_ = fVar286 * auVar14._12_4_ + fVar302 * auVar15._12_4_ + auVar221._12_4_ * fVar231;
  auVar201._16_4_ = fVar233 * auVar14._16_4_ + fVar290 * auVar15._16_4_ + auVar221._16_4_ * fVar227;
  auVar201._20_4_ = fVar235 * auVar14._20_4_ + fVar294 * auVar15._20_4_ + auVar221._20_4_ * fVar228;
  auVar201._24_4_ = fVar270 * auVar14._24_4_ + fVar298 * auVar15._24_4_ + auVar221._24_4_ * fVar229;
  auVar201._28_4_ = fVar207 + auVar12._28_4_ + fVar231;
  auVar11 = vrcpps_avx(auVar106);
  fVar207 = auVar11._0_4_;
  fVar227 = auVar11._4_4_;
  auVar12._4_4_ = auVar106._4_4_ * fVar227;
  auVar12._0_4_ = auVar106._0_4_ * fVar207;
  fVar228 = auVar11._8_4_;
  auVar12._8_4_ = auVar106._8_4_ * fVar228;
  fVar229 = auVar11._12_4_;
  auVar12._12_4_ = auVar106._12_4_ * fVar229;
  fVar231 = auVar11._16_4_;
  auVar12._16_4_ = auVar106._16_4_ * fVar231;
  fVar233 = auVar11._20_4_;
  auVar12._20_4_ = auVar106._20_4_ * fVar233;
  fVar235 = auVar11._24_4_;
  auVar12._24_4_ = auVar106._24_4_ * fVar235;
  auVar12._28_4_ = auVar106._28_4_;
  auVar323._8_4_ = 0x3f800000;
  auVar323._0_8_ = 0x3f8000003f800000;
  auVar323._12_4_ = 0x3f800000;
  auVar323._16_4_ = 0x3f800000;
  auVar323._20_4_ = 0x3f800000;
  auVar323._24_4_ = 0x3f800000;
  auVar323._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar323,auVar12);
  auVar106 = vrcpps_avx(auVar10);
  fVar207 = fVar207 + fVar207 * auVar12._0_4_;
  fVar227 = fVar227 + fVar227 * auVar12._4_4_;
  fVar228 = fVar228 + fVar228 * auVar12._8_4_;
  fVar229 = fVar229 + fVar229 * auVar12._12_4_;
  fVar231 = fVar231 + fVar231 * auVar12._16_4_;
  fVar233 = fVar233 + fVar233 * auVar12._20_4_;
  fVar235 = fVar235 + fVar235 * auVar12._24_4_;
  fVar237 = auVar106._0_4_;
  fVar258 = auVar106._4_4_;
  auVar13._4_4_ = fVar258 * auVar10._4_4_;
  auVar13._0_4_ = fVar237 * auVar10._0_4_;
  fVar260 = auVar106._8_4_;
  auVar13._8_4_ = fVar260 * auVar10._8_4_;
  fVar262 = auVar106._12_4_;
  auVar13._12_4_ = fVar262 * auVar10._12_4_;
  fVar264 = auVar106._16_4_;
  auVar13._16_4_ = fVar264 * auVar10._16_4_;
  fVar266 = auVar106._20_4_;
  auVar13._20_4_ = fVar266 * auVar10._20_4_;
  fVar268 = auVar106._24_4_;
  auVar13._24_4_ = fVar268 * auVar10._24_4_;
  auVar13._28_4_ = auVar11._28_4_;
  auVar106 = vsubps_avx(auVar323,auVar13);
  fVar237 = fVar237 + fVar237 * auVar106._0_4_;
  fVar258 = fVar258 + fVar258 * auVar106._4_4_;
  fVar260 = fVar260 + fVar260 * auVar106._8_4_;
  fVar262 = fVar262 + fVar262 * auVar106._12_4_;
  fVar264 = fVar264 + fVar264 * auVar106._16_4_;
  fVar266 = fVar266 + fVar266 * auVar106._20_4_;
  fVar268 = fVar268 + fVar268 * auVar106._24_4_;
  auVar106 = vrcpps_avx(auVar94);
  fVar270 = auVar106._0_4_;
  fVar286 = auVar106._4_4_;
  auVar10._4_4_ = fVar286 * auVar94._4_4_;
  auVar10._0_4_ = fVar270 * auVar94._0_4_;
  fVar290 = auVar106._8_4_;
  auVar10._8_4_ = fVar290 * auVar94._8_4_;
  fVar294 = auVar106._12_4_;
  auVar10._12_4_ = fVar294 * auVar94._12_4_;
  fVar298 = auVar106._16_4_;
  auVar10._16_4_ = fVar298 * auVar94._16_4_;
  fVar302 = auVar106._20_4_;
  auVar10._20_4_ = fVar302 * auVar94._20_4_;
  fVar306 = auVar106._24_4_;
  auVar10._24_4_ = fVar306 * auVar94._24_4_;
  auVar10._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(auVar323,auVar10);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar128 = vpmovsxwd_avx(auVar128);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar81 * 7 + 0xe);
  auVar16 = vpmovsxwd_avx(auVar16);
  fVar270 = fVar270 + fVar270 * auVar94._0_4_;
  fVar286 = fVar286 + fVar286 * auVar94._4_4_;
  fVar290 = fVar290 + fVar290 * auVar94._8_4_;
  fVar294 = fVar294 + fVar294 * auVar94._12_4_;
  fVar298 = fVar298 + fVar298 * auVar94._16_4_;
  fVar302 = fVar302 + fVar302 * auVar94._20_4_;
  fVar306 = fVar306 + fVar306 * auVar94._24_4_;
  auVar95._16_16_ = auVar16;
  auVar95._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,auVar140);
  auVar90._0_4_ = fVar207 * auVar94._0_4_;
  auVar90._4_4_ = fVar227 * auVar94._4_4_;
  auVar90._8_4_ = fVar228 * auVar94._8_4_;
  auVar90._12_4_ = fVar229 * auVar94._12_4_;
  auVar11._16_4_ = fVar231 * auVar94._16_4_;
  auVar11._0_16_ = auVar90;
  auVar11._20_4_ = fVar233 * auVar94._20_4_;
  auVar11._24_4_ = fVar235 * auVar94._24_4_;
  auVar11._28_4_ = auVar94._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar128 = vpmovsxwd_avx(auVar19);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar81 * 9 + 0xe);
  auVar16 = vpmovsxwd_avx(auVar190);
  auVar314._16_16_ = auVar16;
  auVar314._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar314);
  auVar94 = vsubps_avx(auVar94,auVar140);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 6);
  auVar128 = vpmovsxwd_avx(auVar275);
  auVar127._0_4_ = fVar207 * auVar94._0_4_;
  auVar127._4_4_ = fVar227 * auVar94._4_4_;
  auVar127._8_4_ = fVar228 * auVar94._8_4_;
  auVar127._12_4_ = fVar229 * auVar94._12_4_;
  auVar14._16_4_ = fVar231 * auVar94._16_4_;
  auVar14._0_16_ = auVar127;
  auVar14._20_4_ = fVar233 * auVar94._20_4_;
  auVar14._24_4_ = fVar235 * auVar94._24_4_;
  auVar14._28_4_ = auVar94._28_4_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 0xe);
  auVar16 = vpmovsxwd_avx(auVar2);
  auVar219._16_16_ = auVar16;
  auVar219._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar219);
  auVar94 = vsubps_avx(auVar94,auVar164);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar128 = vpmovsxwd_avx(auVar88);
  auVar208._0_4_ = fVar237 * auVar94._0_4_;
  auVar208._4_4_ = fVar258 * auVar94._4_4_;
  auVar208._8_4_ = fVar260 * auVar94._8_4_;
  auVar208._12_4_ = fVar262 * auVar94._12_4_;
  auVar15._16_4_ = fVar264 * auVar94._16_4_;
  auVar15._0_16_ = auVar208;
  auVar15._20_4_ = fVar266 * auVar94._20_4_;
  auVar15._24_4_ = fVar268 * auVar94._24_4_;
  auVar15._28_4_ = auVar94._28_4_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 0xe);
  auVar16 = vpmovsxwd_avx(auVar158);
  auVar315._16_16_ = auVar16;
  auVar315._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar315);
  auVar94 = vsubps_avx(auVar94,auVar164);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 6);
  auVar128 = vpmovsxwd_avx(auVar187);
  auVar157._0_4_ = fVar237 * auVar94._0_4_;
  auVar157._4_4_ = fVar258 * auVar94._4_4_;
  auVar157._8_4_ = fVar260 * auVar94._8_4_;
  auVar157._12_4_ = fVar262 * auVar94._12_4_;
  auVar221._16_4_ = fVar264 * auVar94._16_4_;
  auVar221._0_16_ = auVar157;
  auVar221._20_4_ = fVar266 * auVar94._20_4_;
  auVar221._24_4_ = fVar268 * auVar94._24_4_;
  auVar221._28_4_ = auVar94._28_4_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 0xe);
  auVar16 = vpmovsxwd_avx(auVar3);
  auVar247._16_16_ = auVar16;
  auVar247._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar247);
  auVar94 = vsubps_avx(auVar94,auVar201);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar128 = vpmovsxwd_avx(auVar4);
  auVar239._0_4_ = fVar270 * auVar94._0_4_;
  auVar239._4_4_ = fVar286 * auVar94._4_4_;
  auVar239._8_4_ = fVar290 * auVar94._8_4_;
  auVar239._12_4_ = fVar294 * auVar94._12_4_;
  auVar20._16_4_ = fVar298 * auVar94._16_4_;
  auVar20._0_16_ = auVar239;
  auVar20._20_4_ = fVar302 * auVar94._20_4_;
  auVar20._24_4_ = fVar306 * auVar94._24_4_;
  auVar20._28_4_ = auVar94._28_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 0xe);
  auVar16 = vpmovsxwd_avx(auVar93);
  auVar316._16_16_ = auVar16;
  auVar316._0_16_ = auVar128;
  auVar94 = vcvtdq2ps_avx(auVar316);
  auVar94 = vsubps_avx(auVar94,auVar201);
  auVar184._0_4_ = fVar270 * auVar94._0_4_;
  auVar184._4_4_ = fVar286 * auVar94._4_4_;
  auVar184._8_4_ = fVar290 * auVar94._8_4_;
  auVar184._12_4_ = fVar294 * auVar94._12_4_;
  auVar21._16_4_ = fVar298 * auVar94._16_4_;
  auVar21._0_16_ = auVar184;
  auVar21._20_4_ = fVar302 * auVar94._20_4_;
  auVar21._24_4_ = fVar306 * auVar94._24_4_;
  auVar21._28_4_ = auVar94._28_4_;
  auVar128 = vpminsd_avx(auVar11._16_16_,auVar14._16_16_);
  auVar16 = vpminsd_avx(auVar90,auVar127);
  auVar324._16_16_ = auVar128;
  auVar324._0_16_ = auVar16;
  auVar128 = vpminsd_avx(auVar15._16_16_,auVar221._16_16_);
  auVar16 = vpminsd_avx(auVar208,auVar157);
  auVar332._16_16_ = auVar128;
  auVar332._0_16_ = auVar16;
  auVar94 = vmaxps_avx(auVar324,auVar332);
  auVar128 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar16 = vpminsd_avx(auVar239,auVar184);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar395._4_4_ = uVar1;
  auVar395._0_4_ = uVar1;
  auVar395._8_4_ = uVar1;
  auVar395._12_4_ = uVar1;
  auVar395._16_4_ = uVar1;
  auVar395._20_4_ = uVar1;
  auVar395._24_4_ = uVar1;
  auVar395._28_4_ = uVar1;
  auVar376._16_16_ = auVar128;
  auVar376._0_16_ = auVar16;
  auVar106 = vmaxps_avx(auVar376,auVar395);
  auVar94 = vmaxps_avx(auVar94,auVar106);
  local_400._4_4_ = auVar94._4_4_ * 0.99999964;
  local_400._0_4_ = auVar94._0_4_ * 0.99999964;
  local_400._8_4_ = auVar94._8_4_ * 0.99999964;
  local_400._12_4_ = auVar94._12_4_ * 0.99999964;
  local_400._16_4_ = auVar94._16_4_ * 0.99999964;
  local_400._20_4_ = auVar94._20_4_ * 0.99999964;
  local_400._24_4_ = auVar94._24_4_ * 0.99999964;
  local_400._28_4_ = auVar94._28_4_;
  auVar128 = vpmaxsd_avx(auVar11._16_16_,auVar14._16_16_);
  auVar16 = vpmaxsd_avx(auVar90,auVar127);
  auVar96._16_16_ = auVar128;
  auVar96._0_16_ = auVar16;
  auVar128 = vpmaxsd_avx(auVar15._16_16_,auVar221._16_16_);
  auVar16 = vpmaxsd_avx(auVar208,auVar157);
  auVar141._16_16_ = auVar128;
  auVar141._0_16_ = auVar16;
  auVar94 = vminps_avx(auVar96,auVar141);
  auVar128 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar16 = vpmaxsd_avx(auVar239,auVar184);
  auVar142._16_16_ = auVar128;
  auVar142._0_16_ = auVar16;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar165._4_4_ = uVar1;
  auVar165._0_4_ = uVar1;
  auVar165._8_4_ = uVar1;
  auVar165._12_4_ = uVar1;
  auVar165._16_4_ = uVar1;
  auVar165._20_4_ = uVar1;
  auVar165._24_4_ = uVar1;
  auVar165._28_4_ = uVar1;
  auVar106 = vminps_avx(auVar142,auVar165);
  auVar94 = vminps_avx(auVar94,auVar106);
  auVar106._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar106._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar106._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar106._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar106._16_4_ = auVar94._16_4_ * 1.0000004;
  auVar106._20_4_ = auVar94._20_4_ * 1.0000004;
  auVar106._24_4_ = auVar94._24_4_ * 1.0000004;
  auVar106._28_4_ = auVar94._28_4_;
  auVar94 = vcmpps_avx(local_400,auVar106,2);
  auVar128 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar143._16_16_ = auVar128;
  auVar143._0_16_ = auVar128;
  auVar106 = vcvtdq2ps_avx(auVar143);
  auVar106 = vcmpps_avx(_DAT_01f7b060,auVar106,1);
  auVar94 = vandps_avx(auVar94,auVar106);
  uVar75 = vmovmskps_avx(auVar94);
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_540 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  uVar82 = 1 << ((byte)k & 0x1f);
  local_b08 = (undefined1 (*) [32])&local_6a0;
  local_b10 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
  local_b18 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar82 >> 4) * 0x10);
  local_968 = prim;
LAB_0097dd4f:
  uVar81 = (ulong)uVar75;
  if (uVar81 == 0) {
    return;
  }
  lVar77 = 0;
  if (uVar81 != 0) {
    for (; (uVar75 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
    }
  }
  uVar81 = uVar81 - 1 & uVar81;
  local_960 = *(uint *)(local_968 + lVar77 * 4 + 6);
  lVar77 = lVar77 * 0x40;
  lVar9 = 0;
  if (uVar81 != 0) {
    for (; (uVar81 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar75 = *(uint *)(local_968 + 2);
  auVar128 = *(undefined1 (*) [16])(local_970 + lVar77);
  if (((uVar81 != 0) && (uVar80 = uVar81 - 1 & uVar81, uVar80 != 0)) && (lVar9 = 0, uVar80 != 0)) {
    for (; (uVar80 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar16 = *(undefined1 (*) [16])(local_970 + lVar77 + 0x10);
  auVar19 = *(undefined1 (*) [16])(local_970 + lVar77 + 0x20);
  auVar190 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar2 = vinsertps_avx(auVar190,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar207 = *(float *)(ray + k * 4 + 0x80);
  auVar361._4_4_ = fVar207;
  auVar361._0_4_ = fVar207;
  auVar361._8_4_ = fVar207;
  auVar361._12_4_ = fVar207;
  fStack_af0 = fVar207;
  _local_b00 = auVar361;
  fStack_aec = fVar207;
  fStack_ae8 = fVar207;
  fStack_ae4 = fVar207;
  auVar190 = *(undefined1 (*) [16])(local_970 + lVar77 + 0x30);
  fVar227 = *(float *)(ray + k * 4 + 0xa0);
  auVar375._4_4_ = fVar227;
  auVar375._0_4_ = fVar227;
  auVar375._8_4_ = fVar227;
  auVar375._12_4_ = fVar227;
  fStack_850 = fVar227;
  _local_860 = auVar375;
  fStack_84c = fVar227;
  fStack_848 = fVar227;
  fStack_844 = fVar227;
  auVar275 = vunpcklps_avx(auVar361,auVar375);
  fVar228 = *(float *)(ray + k * 4 + 0xc0);
  auVar391._4_4_ = fVar228;
  auVar391._0_4_ = fVar228;
  auVar391._8_4_ = fVar228;
  auVar391._12_4_ = fVar228;
  fStack_910 = fVar228;
  _local_920 = auVar391;
  fStack_90c = fVar228;
  fStack_908 = fVar228;
  fStack_904 = fVar228;
  _local_a70 = vinsertps_avx(auVar275,auVar391,0x28);
  auVar86._0_4_ = (auVar128._0_4_ + auVar16._0_4_ + auVar19._0_4_ + auVar190._0_4_) * 0.25;
  auVar86._4_4_ = (auVar128._4_4_ + auVar16._4_4_ + auVar19._4_4_ + auVar190._4_4_) * 0.25;
  auVar86._8_4_ = (auVar128._8_4_ + auVar16._8_4_ + auVar19._8_4_ + auVar190._8_4_) * 0.25;
  auVar86._12_4_ = (auVar128._12_4_ + auVar16._12_4_ + auVar19._12_4_ + auVar190._12_4_) * 0.25;
  auVar275 = vsubps_avx(auVar86,auVar2);
  auVar275 = vdpps_avx(auVar275,_local_a70,0x7f);
  local_a80 = vdpps_avx(_local_a70,_local_a70,0x7f);
  auVar88 = vrcpss_avx(local_a80,local_a80);
  fVar229 = auVar275._0_4_ * auVar88._0_4_ * (2.0 - local_a80._0_4_ * auVar88._0_4_);
  auVar88 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
  auVar209._0_4_ = auVar2._0_4_ + local_a70._0_4_ * auVar88._0_4_;
  auVar209._4_4_ = auVar2._4_4_ + local_a70._4_4_ * auVar88._4_4_;
  auVar209._8_4_ = auVar2._8_4_ + local_a70._8_4_ * auVar88._8_4_;
  auVar209._12_4_ = auVar2._12_4_ + local_a70._12_4_ * auVar88._12_4_;
  auVar275 = vblendps_avx(auVar209,_DAT_01f45a50,8);
  _local_be0 = vsubps_avx(auVar128,auVar275);
  _local_bf0 = vsubps_avx(auVar19,auVar275);
  _local_c00 = vsubps_avx(auVar16,auVar275);
  _local_c10 = vsubps_avx(auVar190,auVar275);
  auVar128 = vshufps_avx(_local_be0,_local_be0,0);
  register0x00001250 = auVar128;
  _local_1e0 = auVar128;
  auVar128 = vshufps_avx(_local_be0,_local_be0,0x55);
  local_aa0._16_16_ = auVar128;
  local_aa0._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_be0,_local_be0,0xaa);
  local_380._16_16_ = auVar128;
  local_380._0_16_ = auVar128;
  auVar16 = vshufps_avx(_local_be0,_local_be0,0xff);
  auVar128 = vshufps_avx(_local_c00,_local_c00,0);
  auVar280._16_16_ = auVar128;
  auVar280._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_c00,_local_c00,0x55);
  local_9e0._16_16_ = auVar128;
  local_9e0._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_c00,_local_c00,0xaa);
  auVar352._16_16_ = auVar128;
  auVar352._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_c00,_local_c00,0xff);
  local_a20._16_16_ = auVar128;
  local_a20._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_bf0,_local_bf0,0);
  local_3a0._16_16_ = auVar128;
  local_3a0._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_bf0,_local_bf0,0x55);
  local_3c0._16_16_ = auVar128;
  local_3c0._0_16_ = auVar128;
  auVar128 = vshufps_avx(_local_bf0,_local_bf0,0xaa);
  register0x00001290 = auVar128;
  _local_200 = auVar128;
  auVar128 = vshufps_avx(_local_bf0,_local_bf0,0xff);
  register0x00001290 = auVar128;
  _local_220 = auVar128;
  auVar128 = vshufps_avx(_local_c10,_local_c10,0);
  register0x00001290 = auVar128;
  _local_240 = auVar128;
  auVar128 = vshufps_avx(_local_c10,_local_c10,0x55);
  register0x00001290 = auVar128;
  _local_260 = auVar128;
  auVar128 = vshufps_avx(_local_c10,_local_c10,0xaa);
  register0x00001290 = auVar128;
  _local_280 = auVar128;
  auVar128 = vshufps_avx(_local_c10,_local_c10,0xff);
  register0x00001290 = auVar128;
  _local_2a0 = auVar128;
  auVar128 = ZEXT416((uint)(fVar207 * fVar207 + fVar227 * fVar227 + fVar228 * fVar228));
  auVar128 = vshufps_avx(auVar128,auVar128,0);
  local_2c0._16_16_ = auVar128;
  local_2c0._0_16_ = auVar128;
  fVar207 = *(float *)(ray + k * 4 + 0x60);
  local_980 = ZEXT416((uint)fVar229);
  auVar393 = ZEXT3264(local_9e0);
  auVar128 = vshufps_avx(ZEXT416((uint)(fVar207 - fVar229)),ZEXT416((uint)(fVar207 - fVar229)),0);
  local_3e0._16_16_ = auVar128;
  local_3e0._0_16_ = auVar128;
  auVar128 = vpshufd_avx(ZEXT416(uVar75),0);
  local_600._16_16_ = auVar128;
  local_600._0_16_ = auVar128;
  auVar128 = vpshufd_avx(ZEXT416(local_960),0);
  local_620._16_16_ = auVar128;
  local_620._0_16_ = auVar128;
  register0x00001210 = auVar88;
  _local_940 = auVar88;
  uVar80 = 0;
  local_d64 = 1;
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_2c0,auVar98);
  auVar128 = vsqrtss_avx(local_a80,local_a80);
  auVar19 = vsqrtss_avx(local_a80,local_a80);
  auVar339 = ZEXT3264(local_aa0);
  auVar285 = ZEXT3264(local_a20);
  local_790 = ZEXT816(0x3f80000000000000);
  local_5c0 = auVar280;
  local_b80 = auVar352;
  do {
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = 0x3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar202._16_4_ = 0x3f800000;
    auVar202._20_4_ = 0x3f800000;
    auVar202._24_4_ = 0x3f800000;
    auVar202._28_4_ = 0x3f800000;
    auVar190 = vmovshdup_avx(local_790);
    auVar2 = vsubps_avx(auVar190,local_790);
    auVar190 = vshufps_avx(local_790,local_790,0);
    auVar275 = vshufps_avx(auVar2,auVar2,0);
    fVar125 = auVar275._0_4_;
    fVar154 = auVar275._4_4_;
    fVar155 = auVar275._8_4_;
    fVar156 = auVar275._12_4_;
    fVar84 = auVar190._0_4_;
    auVar144._0_4_ = fVar84 + fVar125 * 0.0;
    fVar116 = auVar190._4_4_;
    auVar144._4_4_ = fVar116 + fVar154 * 0.14285715;
    fVar118 = auVar190._8_4_;
    auVar144._8_4_ = fVar118 + fVar155 * 0.2857143;
    fVar120 = auVar190._12_4_;
    auVar144._12_4_ = fVar120 + fVar156 * 0.42857146;
    auVar144._16_4_ = fVar84 + fVar125 * 0.5714286;
    auVar144._20_4_ = fVar116 + fVar154 * 0.71428573;
    auVar144._24_4_ = fVar118 + fVar155 * 0.8571429;
    auVar144._28_4_ = fVar120 + fVar156;
    auVar94 = vsubps_avx(auVar202,auVar144);
    fVar227 = auVar280._28_4_;
    fVar229 = auVar94._0_4_;
    fVar231 = auVar94._4_4_;
    fVar233 = auVar94._8_4_;
    fVar235 = auVar94._12_4_;
    fVar270 = auVar94._16_4_;
    fVar286 = auVar94._20_4_;
    fVar290 = auVar94._24_4_;
    fVar262 = auVar285._28_4_ + fVar227 + auVar352._28_4_ + 1.0 + 1.0;
    fVar228 = local_380._28_4_;
    fVar271 = local_3a0._0_4_ * auVar144._0_4_ + auVar280._0_4_ * fVar229;
    fVar287 = local_3a0._4_4_ * auVar144._4_4_ + auVar280._4_4_ * fVar231;
    fVar291 = local_3a0._8_4_ * auVar144._8_4_ + auVar280._8_4_ * fVar233;
    fVar295 = local_3a0._12_4_ * auVar144._12_4_ + auVar280._12_4_ * fVar235;
    fVar299 = local_3a0._16_4_ * auVar144._16_4_ + auVar280._16_4_ * fVar270;
    fVar303 = local_3a0._20_4_ * auVar144._20_4_ + auVar280._20_4_ * fVar286;
    fVar307 = local_3a0._24_4_ * auVar144._24_4_ + auVar280._24_4_ * fVar290;
    fVar294 = local_3c0._0_4_ * auVar144._0_4_ + auVar393._0_4_ * fVar229;
    fVar298 = local_3c0._4_4_ * auVar144._4_4_ + auVar393._4_4_ * fVar231;
    fVar302 = local_3c0._8_4_ * auVar144._8_4_ + auVar393._8_4_ * fVar233;
    fVar306 = local_3c0._12_4_ * auVar144._12_4_ + auVar393._12_4_ * fVar235;
    fVar237 = local_3c0._16_4_ * auVar144._16_4_ + auVar393._16_4_ * fVar270;
    fVar258 = local_3c0._20_4_ * auVar144._20_4_ + auVar393._20_4_ * fVar286;
    fVar260 = local_3c0._24_4_ * auVar144._24_4_ + auVar393._24_4_ * fVar290;
    fVar264 = (float)local_200._0_4_ * auVar144._0_4_ + auVar352._0_4_ * fVar229;
    fVar266 = (float)local_200._4_4_ * auVar144._4_4_ + auVar352._4_4_ * fVar231;
    fVar268 = fStack_1f8 * auVar144._8_4_ + auVar352._8_4_ * fVar233;
    fVar230 = fStack_1f4 * auVar144._12_4_ + auVar352._12_4_ * fVar235;
    fVar232 = fStack_1f0 * auVar144._16_4_ + auVar352._16_4_ * fVar270;
    fVar234 = fStack_1ec * auVar144._20_4_ + auVar352._20_4_ * fVar286;
    fVar236 = fStack_1e8 * auVar144._24_4_ + auVar352._24_4_ * fVar290;
    fVar238 = (float)local_220._0_4_ * auVar144._0_4_ + auVar285._0_4_ * fVar229;
    fVar259 = (float)local_220._4_4_ * auVar144._4_4_ + auVar285._4_4_ * fVar231;
    fVar261 = fStack_218 * auVar144._8_4_ + auVar285._8_4_ * fVar233;
    fVar263 = fStack_214 * auVar144._12_4_ + auVar285._12_4_ * fVar235;
    fVar265 = fStack_210 * auVar144._16_4_ + auVar285._16_4_ * fVar270;
    fVar267 = fStack_20c * auVar144._20_4_ + auVar285._20_4_ * fVar286;
    fVar269 = fStack_208 * auVar144._24_4_ + auVar285._24_4_ * fVar290;
    fVar390 = fVar228 + fVar227;
    fVar372 = auVar16._12_4_ + fVar228;
    auVar325._0_4_ =
         fVar229 * (auVar280._0_4_ * auVar144._0_4_ + fVar229 * (float)local_1e0._0_4_) +
         auVar144._0_4_ * fVar271;
    auVar325._4_4_ =
         fVar231 * (auVar280._4_4_ * auVar144._4_4_ + fVar231 * (float)local_1e0._4_4_) +
         auVar144._4_4_ * fVar287;
    auVar325._8_4_ =
         fVar233 * (auVar280._8_4_ * auVar144._8_4_ + fVar233 * fStack_1d8) +
         auVar144._8_4_ * fVar291;
    auVar325._12_4_ =
         fVar235 * (auVar280._12_4_ * auVar144._12_4_ + fVar235 * fStack_1d4) +
         auVar144._12_4_ * fVar295;
    auVar325._16_4_ =
         fVar270 * (auVar280._16_4_ * auVar144._16_4_ + fVar270 * fStack_1d0) +
         auVar144._16_4_ * fVar299;
    auVar325._20_4_ =
         fVar286 * (auVar280._20_4_ * auVar144._20_4_ + fVar286 * fStack_1cc) +
         auVar144._20_4_ * fVar303;
    auVar325._24_4_ =
         fVar290 * (auVar280._24_4_ * auVar144._24_4_ + fVar290 * fStack_1c8) +
         auVar144._24_4_ * fVar307;
    auVar325._28_4_ = local_3a0._28_4_ + fVar228;
    auVar337._0_4_ =
         fVar229 * (auVar393._0_4_ * auVar144._0_4_ + auVar339._0_4_ * fVar229) +
         auVar144._0_4_ * fVar294;
    auVar337._4_4_ =
         fVar231 * (auVar393._4_4_ * auVar144._4_4_ + auVar339._4_4_ * fVar231) +
         auVar144._4_4_ * fVar298;
    auVar337._8_4_ =
         fVar233 * (auVar393._8_4_ * auVar144._8_4_ + auVar339._8_4_ * fVar233) +
         auVar144._8_4_ * fVar302;
    auVar337._12_4_ =
         fVar235 * (auVar393._12_4_ * auVar144._12_4_ + auVar339._12_4_ * fVar235) +
         auVar144._12_4_ * fVar306;
    auVar337._16_4_ =
         fVar270 * (auVar393._16_4_ * auVar144._16_4_ + auVar339._16_4_ * fVar270) +
         auVar144._16_4_ * fVar237;
    auVar337._20_4_ =
         fVar286 * (auVar393._20_4_ * auVar144._20_4_ + auVar339._20_4_ * fVar286) +
         auVar144._20_4_ * fVar258;
    auVar337._24_4_ =
         fVar290 * (auVar393._24_4_ * auVar144._24_4_ + auVar339._24_4_ * fVar290) +
         auVar144._24_4_ * fVar260;
    auVar337._28_4_ = local_3c0._28_4_ + fVar228;
    auVar348._0_4_ =
         fVar229 * (auVar352._0_4_ * auVar144._0_4_ + local_380._0_4_ * fVar229) +
         auVar144._0_4_ * fVar264;
    auVar348._4_4_ =
         fVar231 * (auVar352._4_4_ * auVar144._4_4_ + local_380._4_4_ * fVar231) +
         auVar144._4_4_ * fVar266;
    auVar348._8_4_ =
         fVar233 * (auVar352._8_4_ * auVar144._8_4_ + local_380._8_4_ * fVar233) +
         auVar144._8_4_ * fVar268;
    auVar348._12_4_ =
         fVar235 * (auVar352._12_4_ * auVar144._12_4_ + local_380._12_4_ * fVar235) +
         auVar144._12_4_ * fVar230;
    auVar348._16_4_ =
         fVar270 * (auVar352._16_4_ * auVar144._16_4_ + local_380._16_4_ * fVar270) +
         auVar144._16_4_ * fVar232;
    auVar348._20_4_ =
         fVar286 * (auVar352._20_4_ * auVar144._20_4_ + local_380._20_4_ * fVar286) +
         auVar144._20_4_ * fVar234;
    auVar348._24_4_ =
         fVar290 * (auVar352._24_4_ * auVar144._24_4_ + local_380._24_4_ * fVar290) +
         auVar144._24_4_ * fVar236;
    auVar348._28_4_ = fStack_1e4 + fVar228;
    auVar317._0_4_ =
         auVar144._0_4_ * fVar238 +
         fVar229 * (auVar285._0_4_ * auVar144._0_4_ + auVar16._0_4_ * fVar229);
    auVar317._4_4_ =
         auVar144._4_4_ * fVar259 +
         fVar231 * (auVar285._4_4_ * auVar144._4_4_ + auVar16._4_4_ * fVar231);
    auVar317._8_4_ =
         auVar144._8_4_ * fVar261 +
         fVar233 * (auVar285._8_4_ * auVar144._8_4_ + auVar16._8_4_ * fVar233);
    auVar317._12_4_ =
         auVar144._12_4_ * fVar263 +
         fVar235 * (auVar285._12_4_ * auVar144._12_4_ + auVar16._12_4_ * fVar235);
    auVar317._16_4_ =
         auVar144._16_4_ * fVar265 +
         fVar270 * (auVar285._16_4_ * auVar144._16_4_ + auVar16._0_4_ * fVar270);
    auVar317._20_4_ =
         auVar144._20_4_ * fVar267 +
         fVar286 * (auVar285._20_4_ * auVar144._20_4_ + auVar16._4_4_ * fVar286);
    auVar317._24_4_ =
         auVar144._24_4_ * fVar269 +
         fVar290 * (auVar285._24_4_ * auVar144._24_4_ + auVar16._8_4_ * fVar290);
    auVar317._28_4_ = fStack_1e4 + fStack_204;
    auVar99._0_4_ =
         (auVar144._0_4_ * (float)local_240._0_4_ + local_3a0._0_4_ * fVar229) * auVar144._0_4_ +
         fVar229 * fVar271;
    auVar99._4_4_ =
         (auVar144._4_4_ * (float)local_240._4_4_ + local_3a0._4_4_ * fVar231) * auVar144._4_4_ +
         fVar231 * fVar287;
    auVar99._8_4_ =
         (auVar144._8_4_ * fStack_238 + local_3a0._8_4_ * fVar233) * auVar144._8_4_ +
         fVar233 * fVar291;
    auVar99._12_4_ =
         (auVar144._12_4_ * fStack_234 + local_3a0._12_4_ * fVar235) * auVar144._12_4_ +
         fVar235 * fVar295;
    auVar99._16_4_ =
         (auVar144._16_4_ * fStack_230 + local_3a0._16_4_ * fVar270) * auVar144._16_4_ +
         fVar270 * fVar299;
    auVar99._20_4_ =
         (auVar144._20_4_ * fStack_22c + local_3a0._20_4_ * fVar286) * auVar144._20_4_ +
         fVar286 * fVar303;
    auVar99._24_4_ =
         (auVar144._24_4_ * fStack_228 + local_3a0._24_4_ * fVar290) * auVar144._24_4_ +
         fVar290 * fVar307;
    auVar99._28_4_ = fStack_1e4 + fVar262 + auVar285._28_4_;
    auVar203._0_4_ =
         (auVar144._0_4_ * (float)local_260._0_4_ + local_3c0._0_4_ * fVar229) * auVar144._0_4_ +
         fVar229 * fVar294;
    auVar203._4_4_ =
         (auVar144._4_4_ * (float)local_260._4_4_ + local_3c0._4_4_ * fVar231) * auVar144._4_4_ +
         fVar231 * fVar298;
    auVar203._8_4_ =
         (auVar144._8_4_ * fStack_258 + local_3c0._8_4_ * fVar233) * auVar144._8_4_ +
         fVar233 * fVar302;
    auVar203._12_4_ =
         (auVar144._12_4_ * fStack_254 + local_3c0._12_4_ * fVar235) * auVar144._12_4_ +
         fVar235 * fVar306;
    auVar203._16_4_ =
         (auVar144._16_4_ * fStack_250 + local_3c0._16_4_ * fVar270) * auVar144._16_4_ +
         fVar270 * fVar237;
    auVar203._20_4_ =
         (auVar144._20_4_ * fStack_24c + local_3c0._20_4_ * fVar286) * auVar144._20_4_ +
         fVar286 * fVar258;
    auVar203._24_4_ =
         (auVar144._24_4_ * fStack_248 + local_3c0._24_4_ * fVar290) * auVar144._24_4_ +
         fVar290 * fVar260;
    auVar203._28_4_ = fStack_1e4 + fVar262 + 1.0;
    auVar220._0_4_ =
         (auVar144._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar229) *
         auVar144._0_4_ + fVar229 * fVar264;
    auVar220._4_4_ =
         (auVar144._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar231) *
         auVar144._4_4_ + fVar231 * fVar266;
    auVar220._8_4_ =
         (auVar144._8_4_ * fStack_278 + fStack_1f8 * fVar233) * auVar144._8_4_ + fVar233 * fVar268;
    auVar220._12_4_ =
         (auVar144._12_4_ * fStack_274 + fStack_1f4 * fVar235) * auVar144._12_4_ + fVar235 * fVar230
    ;
    auVar220._16_4_ =
         (auVar144._16_4_ * fStack_270 + fStack_1f0 * fVar270) * auVar144._16_4_ + fVar270 * fVar232
    ;
    auVar220._20_4_ =
         (auVar144._20_4_ * fStack_26c + fStack_1ec * fVar286) * auVar144._20_4_ + fVar286 * fVar234
    ;
    auVar220._24_4_ =
         (auVar144._24_4_ * fStack_268 + fStack_1e8 * fVar290) * auVar144._24_4_ + fVar290 * fVar236
    ;
    auVar220._28_4_ = fVar372 + fVar227 + 1.0;
    auVar248._0_4_ =
         (auVar144._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar229) *
         auVar144._0_4_ + fVar229 * fVar238;
    auVar248._4_4_ =
         (auVar144._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar231) *
         auVar144._4_4_ + fVar231 * fVar259;
    auVar248._8_4_ =
         (auVar144._8_4_ * fStack_298 + fStack_218 * fVar233) * auVar144._8_4_ + fVar233 * fVar261;
    auVar248._12_4_ =
         (auVar144._12_4_ * fStack_294 + fStack_214 * fVar235) * auVar144._12_4_ + fVar235 * fVar263
    ;
    auVar248._16_4_ =
         (auVar144._16_4_ * fStack_290 + fStack_210 * fVar270) * auVar144._16_4_ + fVar270 * fVar265
    ;
    auVar248._20_4_ =
         (auVar144._20_4_ * fStack_28c + fStack_20c * fVar286) * auVar144._20_4_ + fVar286 * fVar267
    ;
    auVar248._24_4_ =
         (auVar144._24_4_ * fStack_288 + fStack_208 * fVar290) * auVar144._24_4_ + fVar290 * fVar269
    ;
    auVar248._28_4_ = fVar390 + fVar228 + fVar227;
    fVar272 = auVar325._0_4_ * fVar229 + auVar144._0_4_ * auVar99._0_4_;
    fVar288 = auVar325._4_4_ * fVar231 + auVar144._4_4_ * auVar99._4_4_;
    fVar292 = auVar325._8_4_ * fVar233 + auVar144._8_4_ * auVar99._8_4_;
    fVar296 = auVar325._12_4_ * fVar235 + auVar144._12_4_ * auVar99._12_4_;
    fVar300 = auVar325._16_4_ * fVar270 + auVar144._16_4_ * auVar99._16_4_;
    fVar304 = auVar325._20_4_ * fVar286 + auVar144._20_4_ * auVar99._20_4_;
    fVar308 = auVar325._24_4_ * fVar290 + auVar144._24_4_ * auVar99._24_4_;
    fVar310 = fVar390 + fStack_1e4;
    local_ae0._0_4_ = auVar337._0_4_ * fVar229 + auVar144._0_4_ * auVar203._0_4_;
    local_ae0._4_4_ = auVar337._4_4_ * fVar231 + auVar144._4_4_ * auVar203._4_4_;
    local_ae0._8_4_ = auVar337._8_4_ * fVar233 + auVar144._8_4_ * auVar203._8_4_;
    local_ae0._12_4_ = auVar337._12_4_ * fVar235 + auVar144._12_4_ * auVar203._12_4_;
    local_ae0._16_4_ = auVar337._16_4_ * fVar270 + auVar144._16_4_ * auVar203._16_4_;
    local_ae0._20_4_ = auVar337._20_4_ * fVar286 + auVar144._20_4_ * auVar203._20_4_;
    local_ae0._24_4_ = auVar337._24_4_ * fVar290 + auVar144._24_4_ * auVar203._24_4_;
    local_ae0._28_4_ = fStack_1e4 + fVar372;
    local_300._0_4_ = auVar348._0_4_ * fVar229 + auVar144._0_4_ * auVar220._0_4_;
    local_300._4_4_ = auVar348._4_4_ * fVar231 + auVar144._4_4_ * auVar220._4_4_;
    local_300._8_4_ = auVar348._8_4_ * fVar233 + auVar144._8_4_ * auVar220._8_4_;
    local_300._12_4_ = auVar348._12_4_ * fVar235 + auVar144._12_4_ * auVar220._12_4_;
    local_300._16_4_ = auVar348._16_4_ * fVar270 + auVar144._16_4_ * auVar220._16_4_;
    local_300._20_4_ = auVar348._20_4_ * fVar286 + auVar144._20_4_ * auVar220._20_4_;
    local_300._24_4_ = auVar348._24_4_ * fVar290 + auVar144._24_4_ * auVar220._24_4_;
    local_300._28_4_ = fVar372 + fStack_1e4;
    local_d20._0_4_ = auVar2._0_4_;
    auVar281._0_4_ = fVar229 * auVar317._0_4_ + auVar144._0_4_ * auVar248._0_4_;
    auVar281._4_4_ = fVar231 * auVar317._4_4_ + auVar144._4_4_ * auVar248._4_4_;
    auVar281._8_4_ = fVar233 * auVar317._8_4_ + auVar144._8_4_ * auVar248._8_4_;
    auVar281._12_4_ = fVar235 * auVar317._12_4_ + auVar144._12_4_ * auVar248._12_4_;
    auVar281._16_4_ = fVar270 * auVar317._16_4_ + auVar144._16_4_ * auVar248._16_4_;
    auVar281._20_4_ = fVar286 * auVar317._20_4_ + auVar144._20_4_ * auVar248._20_4_;
    auVar281._24_4_ = fVar290 * auVar317._24_4_ + auVar144._24_4_ * auVar248._24_4_;
    auVar281._28_4_ = auVar94._28_4_ + auVar144._28_4_;
    auVar94 = vsubps_avx(auVar99,auVar325);
    auVar10 = vsubps_avx(auVar203,auVar337);
    auVar106 = vsubps_avx(auVar220,auVar348);
    auVar11 = vsubps_avx(auVar248,auVar317);
    auVar190 = vshufps_avx(ZEXT416((uint)((float)local_d20._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_d20._0_4_ * 0.04761905)),0);
    fVar264 = auVar190._0_4_;
    fVar360 = fVar264 * auVar94._0_4_ * 3.0;
    fVar266 = auVar190._4_4_;
    fVar366 = fVar266 * auVar94._4_4_ * 3.0;
    local_a00._4_4_ = fVar366;
    local_a00._0_4_ = fVar360;
    fVar236 = auVar190._8_4_;
    fVar367 = fVar236 * auVar94._8_4_ * 3.0;
    local_a00._8_4_ = fVar367;
    fVar306 = auVar190._12_4_;
    fVar368 = fVar306 * auVar94._12_4_ * 3.0;
    local_a00._12_4_ = fVar368;
    fVar369 = fVar264 * auVar94._16_4_ * 3.0;
    local_a00._16_4_ = fVar369;
    fVar370 = fVar266 * auVar94._20_4_ * 3.0;
    local_a00._20_4_ = fVar370;
    fVar371 = fVar236 * auVar94._24_4_ * 3.0;
    local_a00._24_4_ = fVar371;
    local_a00._28_4_ = fVar372;
    fVar346 = fVar264 * auVar10._0_4_ * 3.0;
    fVar354 = fVar266 * auVar10._4_4_ * 3.0;
    auVar22._4_4_ = fVar354;
    auVar22._0_4_ = fVar346;
    fVar355 = fVar236 * auVar10._8_4_ * 3.0;
    auVar22._8_4_ = fVar355;
    fVar356 = fVar306 * auVar10._12_4_ * 3.0;
    auVar22._12_4_ = fVar356;
    fVar357 = fVar264 * auVar10._16_4_ * 3.0;
    auVar22._16_4_ = fVar357;
    fVar358 = fVar266 * auVar10._20_4_ * 3.0;
    auVar22._20_4_ = fVar358;
    fVar359 = fVar236 * auVar10._24_4_ * 3.0;
    auVar22._24_4_ = fVar359;
    auVar22._28_4_ = auVar348._28_4_;
    fVar373 = fVar264 * auVar106._0_4_ * 3.0;
    fVar378 = fVar266 * auVar106._4_4_ * 3.0;
    auVar23._4_4_ = fVar378;
    auVar23._0_4_ = fVar373;
    fVar380 = fVar236 * auVar106._8_4_ * 3.0;
    auVar23._8_4_ = fVar380;
    fVar382 = fVar306 * auVar106._12_4_ * 3.0;
    auVar23._12_4_ = fVar382;
    fVar384 = fVar264 * auVar106._16_4_ * 3.0;
    auVar23._16_4_ = fVar384;
    fVar386 = fVar266 * auVar106._20_4_ * 3.0;
    auVar23._20_4_ = fVar386;
    fVar388 = fVar236 * auVar106._24_4_ * 3.0;
    auVar23._24_4_ = fVar388;
    auVar23._28_4_ = fVar390;
    fVar235 = fVar264 * auVar11._0_4_ * 3.0;
    fVar270 = fVar266 * auVar11._4_4_ * 3.0;
    auVar24._4_4_ = fVar270;
    auVar24._0_4_ = fVar235;
    fVar302 = fVar236 * auVar11._8_4_ * 3.0;
    auVar24._8_4_ = fVar302;
    fVar306 = fVar306 * auVar11._12_4_ * 3.0;
    auVar24._12_4_ = fVar306;
    fVar264 = fVar264 * auVar11._16_4_ * 3.0;
    auVar24._16_4_ = fVar264;
    fVar266 = fVar266 * auVar11._20_4_ * 3.0;
    auVar24._20_4_ = fVar266;
    fVar236 = fVar236 * auVar11._24_4_ * 3.0;
    auVar24._24_4_ = fVar236;
    auVar24._28_4_ = auVar10._28_4_;
    auVar94 = vperm2f128_avx(local_ae0,local_ae0,1);
    auVar94 = vshufps_avx(auVar94,local_ae0,0x30);
    auVar11 = vshufps_avx(local_ae0,auVar94,0x29);
    auVar94 = vperm2f128_avx(local_300,local_300,1);
    auVar94 = vshufps_avx(auVar94,local_300,0x30);
    auVar12 = vshufps_avx(local_300,auVar94,0x29);
    auVar106 = vsubps_avx(auVar281,auVar24);
    auVar94 = vperm2f128_avx(auVar106,auVar106,1);
    auVar94 = vshufps_avx(auVar94,auVar106,0x30);
    auVar13 = vshufps_avx(auVar106,auVar94,0x29);
    local_560 = vsubps_avx(auVar11,local_ae0);
    local_320 = vsubps_avx(auVar12,local_300);
    fVar228 = local_560._0_4_;
    fVar286 = local_560._4_4_;
    auVar25._4_4_ = fVar378 * fVar286;
    auVar25._0_4_ = fVar373 * fVar228;
    fVar237 = local_560._8_4_;
    auVar25._8_4_ = fVar380 * fVar237;
    fVar268 = local_560._12_4_;
    auVar25._12_4_ = fVar382 * fVar268;
    fVar259 = local_560._16_4_;
    auVar25._16_4_ = fVar384 * fVar259;
    fVar271 = local_560._20_4_;
    auVar25._20_4_ = fVar386 * fVar271;
    fVar307 = local_560._24_4_;
    auVar25._24_4_ = fVar388 * fVar307;
    auVar25._28_4_ = auVar106._28_4_;
    fVar229 = local_320._0_4_;
    fVar290 = local_320._4_4_;
    auVar26._4_4_ = fVar354 * fVar290;
    auVar26._0_4_ = fVar346 * fVar229;
    fVar258 = local_320._8_4_;
    auVar26._8_4_ = fVar355 * fVar258;
    fVar230 = local_320._12_4_;
    auVar26._12_4_ = fVar356 * fVar230;
    fVar261 = local_320._16_4_;
    auVar26._16_4_ = fVar357 * fVar261;
    fVar287 = local_320._20_4_;
    auVar26._20_4_ = fVar358 * fVar287;
    fVar17 = local_320._24_4_;
    auVar26._24_4_ = fVar359 * fVar17;
    auVar26._28_4_ = auVar94._28_4_;
    auVar15 = vsubps_avx(auVar26,auVar25);
    auVar71._4_4_ = fVar288;
    auVar71._0_4_ = fVar272;
    auVar71._8_4_ = fVar292;
    auVar71._12_4_ = fVar296;
    auVar71._16_4_ = fVar300;
    auVar71._20_4_ = fVar304;
    auVar71._24_4_ = fVar308;
    auVar71._28_4_ = fVar310;
    auVar94 = vperm2f128_avx(auVar71,auVar71,1);
    auVar94 = vshufps_avx(auVar94,auVar71,0x30);
    auVar14 = vshufps_avx(auVar71,auVar94,0x29);
    local_580 = vsubps_avx(auVar14,auVar71);
    auVar27._4_4_ = fVar366 * fVar290;
    auVar27._0_4_ = fVar360 * fVar229;
    auVar27._8_4_ = fVar367 * fVar258;
    auVar27._12_4_ = fVar368 * fVar230;
    auVar27._16_4_ = fVar369 * fVar261;
    auVar27._20_4_ = fVar370 * fVar287;
    auVar27._24_4_ = fVar371 * fVar17;
    auVar27._28_4_ = auVar14._28_4_;
    fVar231 = local_580._0_4_;
    fVar294 = local_580._4_4_;
    auVar28._4_4_ = fVar378 * fVar294;
    auVar28._0_4_ = fVar373 * fVar231;
    fVar260 = local_580._8_4_;
    auVar28._8_4_ = fVar380 * fVar260;
    fVar232 = local_580._12_4_;
    auVar28._12_4_ = fVar382 * fVar232;
    fVar263 = local_580._16_4_;
    auVar28._16_4_ = fVar384 * fVar263;
    fVar291 = local_580._20_4_;
    auVar28._20_4_ = fVar386 * fVar291;
    fVar18 = local_580._24_4_;
    auVar28._24_4_ = fVar388 * fVar18;
    auVar28._28_4_ = auVar325._28_4_;
    auVar221 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar354 * fVar294;
    auVar29._0_4_ = fVar346 * fVar231;
    auVar29._8_4_ = fVar355 * fVar260;
    auVar29._12_4_ = fVar356 * fVar232;
    auVar29._16_4_ = fVar357 * fVar263;
    auVar29._20_4_ = fVar358 * fVar291;
    auVar29._24_4_ = fVar359 * fVar18;
    auVar29._28_4_ = auVar325._28_4_;
    auVar30._4_4_ = fVar366 * fVar286;
    auVar30._0_4_ = fVar360 * fVar228;
    auVar30._8_4_ = fVar367 * fVar237;
    auVar30._12_4_ = fVar368 * fVar268;
    auVar30._16_4_ = fVar369 * fVar259;
    auVar30._20_4_ = fVar370 * fVar271;
    auVar30._24_4_ = fVar371 * fVar307;
    auVar30._28_4_ = auVar337._28_4_;
    auVar20 = vsubps_avx(auVar30,auVar29);
    fVar227 = auVar20._28_4_;
    auVar204._0_4_ = fVar231 * fVar231 + fVar228 * fVar228 + fVar229 * fVar229;
    auVar204._4_4_ = fVar294 * fVar294 + fVar286 * fVar286 + fVar290 * fVar290;
    auVar204._8_4_ = fVar260 * fVar260 + fVar237 * fVar237 + fVar258 * fVar258;
    auVar204._12_4_ = fVar232 * fVar232 + fVar268 * fVar268 + fVar230 * fVar230;
    auVar204._16_4_ = fVar263 * fVar263 + fVar259 * fVar259 + fVar261 * fVar261;
    auVar204._20_4_ = fVar291 * fVar291 + fVar271 * fVar271 + fVar287 * fVar287;
    auVar204._24_4_ = fVar18 * fVar18 + fVar307 * fVar307 + fVar17 * fVar17;
    auVar204._28_4_ = fVar227 + fVar227 + auVar15._28_4_;
    auVar94 = vrcpps_avx(auVar204);
    fVar238 = auVar94._0_4_;
    fVar267 = auVar94._4_4_;
    auVar31._4_4_ = fVar267 * auVar204._4_4_;
    auVar31._0_4_ = fVar238 * auVar204._0_4_;
    fVar269 = auVar94._8_4_;
    auVar31._8_4_ = fVar269 * auVar204._8_4_;
    fVar299 = auVar94._12_4_;
    auVar31._12_4_ = fVar299 * auVar204._12_4_;
    fVar303 = auVar94._16_4_;
    auVar31._16_4_ = fVar303 * auVar204._16_4_;
    fVar328 = auVar94._20_4_;
    auVar31._20_4_ = fVar328 * auVar204._20_4_;
    fVar329 = auVar94._24_4_;
    auVar31._24_4_ = fVar329 * auVar204._24_4_;
    auVar31._28_4_ = auVar337._28_4_;
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar100._16_4_ = 0x3f800000;
    auVar100._20_4_ = 0x3f800000;
    auVar100._24_4_ = 0x3f800000;
    auVar100._28_4_ = 0x3f800000;
    auVar21 = vsubps_avx(auVar100,auVar31);
    fVar238 = fVar238 + fVar238 * auVar21._0_4_;
    fVar267 = fVar267 + fVar267 * auVar21._4_4_;
    fVar269 = fVar269 + fVar269 * auVar21._8_4_;
    fVar299 = fVar299 + fVar299 * auVar21._12_4_;
    fVar303 = fVar303 + fVar303 * auVar21._16_4_;
    fVar328 = fVar328 + fVar328 * auVar21._20_4_;
    fVar329 = fVar329 + fVar329 * auVar21._24_4_;
    auVar106 = vperm2f128_avx(auVar22,auVar22,1);
    auVar106 = vshufps_avx(auVar106,auVar22,0x30);
    local_b60 = vshufps_avx(auVar22,auVar106,0x29);
    auVar106 = vperm2f128_avx(auVar23,auVar23,1);
    auVar106 = vshufps_avx(auVar106,auVar23,0x30);
    local_ac0 = vshufps_avx(auVar23,auVar106,0x29);
    fVar85 = local_ac0._0_4_;
    fVar117 = local_ac0._4_4_;
    auVar32._4_4_ = fVar117 * fVar286;
    auVar32._0_4_ = fVar85 * fVar228;
    fVar119 = local_ac0._8_4_;
    auVar32._8_4_ = fVar119 * fVar237;
    fVar121 = local_ac0._12_4_;
    auVar32._12_4_ = fVar121 * fVar268;
    fVar122 = local_ac0._16_4_;
    auVar32._16_4_ = fVar122 * fVar259;
    fVar123 = local_ac0._20_4_;
    auVar32._20_4_ = fVar123 * fVar271;
    fVar124 = local_ac0._24_4_;
    auVar32._24_4_ = fVar124 * fVar307;
    auVar32._28_4_ = auVar106._28_4_;
    fVar233 = local_b60._0_4_;
    fVar298 = local_b60._4_4_;
    auVar33._4_4_ = fVar290 * fVar298;
    auVar33._0_4_ = fVar229 * fVar233;
    fVar262 = local_b60._8_4_;
    auVar33._8_4_ = fVar258 * fVar262;
    fVar234 = local_b60._12_4_;
    auVar33._12_4_ = fVar230 * fVar234;
    fVar265 = local_b60._16_4_;
    auVar33._16_4_ = fVar261 * fVar265;
    fVar295 = local_b60._20_4_;
    auVar33._20_4_ = fVar287 * fVar295;
    fVar396 = local_b60._24_4_;
    auVar33._24_4_ = fVar17 * fVar396;
    auVar33._28_4_ = auVar348._28_4_;
    auVar95 = vsubps_avx(auVar33,auVar32);
    auVar106 = vperm2f128_avx(local_a00,local_a00,1);
    auVar106 = vshufps_avx(auVar106,local_a00,0x30);
    local_9a0 = vshufps_avx(local_a00,auVar106,0x29);
    fVar374 = local_9a0._0_4_;
    fVar379 = local_9a0._4_4_;
    auVar34._4_4_ = fVar379 * fVar290;
    auVar34._0_4_ = fVar374 * fVar229;
    fVar381 = local_9a0._8_4_;
    auVar34._8_4_ = fVar381 * fVar258;
    fVar383 = local_9a0._12_4_;
    auVar34._12_4_ = fVar383 * fVar230;
    fVar385 = local_9a0._16_4_;
    auVar34._16_4_ = fVar385 * fVar261;
    fVar387 = local_9a0._20_4_;
    auVar34._20_4_ = fVar387 * fVar287;
    fVar389 = local_9a0._24_4_;
    auVar34._24_4_ = fVar389 * fVar17;
    auVar34._28_4_ = auVar106._28_4_;
    auVar35._4_4_ = fVar294 * fVar117;
    auVar35._0_4_ = fVar231 * fVar85;
    auVar35._8_4_ = fVar260 * fVar119;
    auVar35._12_4_ = fVar232 * fVar121;
    auVar35._16_4_ = fVar263 * fVar122;
    auVar35._20_4_ = fVar291 * fVar123;
    auVar35._24_4_ = fVar18 * fVar124;
    auVar35._28_4_ = fVar372;
    auVar106 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar294 * fVar298;
    auVar36._0_4_ = fVar231 * fVar233;
    auVar36._8_4_ = fVar260 * fVar262;
    auVar36._12_4_ = fVar232 * fVar234;
    auVar36._16_4_ = fVar263 * fVar265;
    auVar36._20_4_ = fVar291 * fVar295;
    auVar36._24_4_ = fVar18 * fVar396;
    auVar36._28_4_ = fVar372;
    auVar37._4_4_ = fVar379 * fVar286;
    auVar37._0_4_ = fVar374 * fVar228;
    auVar37._8_4_ = fVar381 * fVar237;
    auVar37._12_4_ = fVar383 * fVar268;
    auVar37._16_4_ = fVar385 * fVar259;
    auVar37._20_4_ = fVar387 * fVar271;
    fVar372 = local_9a0._28_4_;
    auVar37._24_4_ = fVar389 * fVar307;
    auVar37._28_4_ = fVar372;
    auVar96 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ =
         fVar267 * (auVar15._4_4_ * auVar15._4_4_ +
                   auVar20._4_4_ * auVar20._4_4_ + auVar221._4_4_ * auVar221._4_4_);
    auVar38._0_4_ =
         fVar238 * (auVar15._0_4_ * auVar15._0_4_ +
                   auVar20._0_4_ * auVar20._0_4_ + auVar221._0_4_ * auVar221._0_4_);
    auVar38._8_4_ =
         fVar269 * (auVar15._8_4_ * auVar15._8_4_ +
                   auVar20._8_4_ * auVar20._8_4_ + auVar221._8_4_ * auVar221._8_4_);
    auVar38._12_4_ =
         fVar299 * (auVar15._12_4_ * auVar15._12_4_ +
                   auVar20._12_4_ * auVar20._12_4_ + auVar221._12_4_ * auVar221._12_4_);
    auVar38._16_4_ =
         fVar303 * (auVar15._16_4_ * auVar15._16_4_ +
                   auVar20._16_4_ * auVar20._16_4_ + auVar221._16_4_ * auVar221._16_4_);
    auVar38._20_4_ =
         fVar328 * (auVar15._20_4_ * auVar15._20_4_ +
                   auVar20._20_4_ * auVar20._20_4_ + auVar221._20_4_ * auVar221._20_4_);
    auVar38._24_4_ =
         fVar329 * (auVar15._24_4_ * auVar15._24_4_ +
                   auVar20._24_4_ * auVar20._24_4_ + auVar221._24_4_ * auVar221._24_4_);
    auVar38._28_4_ = auVar15._28_4_ + fVar227 + auVar221._28_4_;
    auVar39._4_4_ =
         (auVar95._4_4_ * auVar95._4_4_ +
         auVar106._4_4_ * auVar106._4_4_ + auVar96._4_4_ * auVar96._4_4_) * fVar267;
    auVar39._0_4_ =
         (auVar95._0_4_ * auVar95._0_4_ +
         auVar106._0_4_ * auVar106._0_4_ + auVar96._0_4_ * auVar96._0_4_) * fVar238;
    auVar39._8_4_ =
         (auVar95._8_4_ * auVar95._8_4_ +
         auVar106._8_4_ * auVar106._8_4_ + auVar96._8_4_ * auVar96._8_4_) * fVar269;
    auVar39._12_4_ =
         (auVar95._12_4_ * auVar95._12_4_ +
         auVar106._12_4_ * auVar106._12_4_ + auVar96._12_4_ * auVar96._12_4_) * fVar299;
    auVar39._16_4_ =
         (auVar95._16_4_ * auVar95._16_4_ +
         auVar106._16_4_ * auVar106._16_4_ + auVar96._16_4_ * auVar96._16_4_) * fVar303;
    auVar39._20_4_ =
         (auVar95._20_4_ * auVar95._20_4_ +
         auVar106._20_4_ * auVar106._20_4_ + auVar96._20_4_ * auVar96._20_4_) * fVar328;
    auVar39._24_4_ =
         (auVar95._24_4_ * auVar95._24_4_ +
         auVar106._24_4_ * auVar106._24_4_ + auVar96._24_4_ * auVar96._24_4_) * fVar329;
    auVar39._28_4_ = auVar94._28_4_ + auVar21._28_4_;
    auVar94 = vmaxps_avx(auVar38,auVar39);
    auVar106 = vperm2f128_avx(auVar281,auVar281,1);
    auVar106 = vshufps_avx(auVar106,auVar281,0x30);
    auVar15 = vshufps_avx(auVar281,auVar106,0x29);
    auVar166._0_4_ = auVar281._0_4_ + fVar235;
    auVar166._4_4_ = auVar281._4_4_ + fVar270;
    auVar166._8_4_ = auVar281._8_4_ + fVar302;
    auVar166._12_4_ = auVar281._12_4_ + fVar306;
    auVar166._16_4_ = auVar281._16_4_ + fVar264;
    auVar166._20_4_ = auVar281._20_4_ + fVar266;
    auVar166._24_4_ = auVar281._24_4_ + fVar236;
    auVar166._28_4_ = auVar281._28_4_ + auVar10._28_4_;
    auVar106 = vmaxps_avx(auVar281,auVar166);
    auVar10 = vmaxps_avx(auVar13,auVar15);
    auVar106 = vmaxps_avx(auVar106,auVar10);
    auVar10 = vrsqrtps_avx(auVar204);
    fVar227 = auVar10._0_4_;
    fVar235 = auVar10._4_4_;
    fVar270 = auVar10._8_4_;
    fVar302 = auVar10._12_4_;
    fVar306 = auVar10._16_4_;
    fVar264 = auVar10._20_4_;
    fVar266 = auVar10._24_4_;
    local_640 = fVar227 * 1.5 + fVar227 * fVar227 * fVar227 * auVar204._0_4_ * -0.5;
    fStack_63c = fVar235 * 1.5 + fVar235 * fVar235 * fVar235 * auVar204._4_4_ * -0.5;
    fStack_638 = fVar270 * 1.5 + fVar270 * fVar270 * fVar270 * auVar204._8_4_ * -0.5;
    fStack_634 = fVar302 * 1.5 + fVar302 * fVar302 * fVar302 * auVar204._12_4_ * -0.5;
    fStack_630 = fVar306 * 1.5 + fVar306 * fVar306 * fVar306 * auVar204._16_4_ * -0.5;
    fStack_62c = fVar264 * 1.5 + fVar264 * fVar264 * fVar264 * auVar204._20_4_ * -0.5;
    fStack_628 = fVar266 * 1.5 + fVar266 * fVar266 * fVar266 * auVar204._24_4_ * -0.5;
    auVar221 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8a0 = vsubps_avx(auVar221,local_ae0);
    auVar221 = vsubps_avx(auVar221,local_300);
    fVar335 = auVar221._0_4_;
    fVar340 = auVar221._4_4_;
    fVar341 = auVar221._8_4_;
    fVar342 = auVar221._12_4_;
    fVar343 = auVar221._16_4_;
    fVar344 = auVar221._20_4_;
    fVar345 = auVar221._24_4_;
    fVar235 = local_8a0._0_4_;
    fVar302 = local_8a0._4_4_;
    fVar264 = local_8a0._8_4_;
    fVar236 = local_8a0._12_4_;
    fVar267 = local_8a0._16_4_;
    fVar299 = local_8a0._20_4_;
    fVar328 = local_8a0._24_4_;
    auVar72._4_4_ = fVar288;
    auVar72._0_4_ = fVar272;
    auVar72._8_4_ = fVar292;
    auVar72._12_4_ = fVar296;
    auVar72._16_4_ = fVar300;
    auVar72._20_4_ = fVar304;
    auVar72._24_4_ = fVar308;
    auVar72._28_4_ = fVar310;
    auVar95 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar221 = vsubps_avx(auVar95,auVar72);
    fVar270 = auVar221._0_4_;
    fVar306 = auVar221._4_4_;
    fVar266 = auVar221._8_4_;
    fVar238 = auVar221._12_4_;
    fVar269 = auVar221._16_4_;
    fVar303 = auVar221._20_4_;
    fVar329 = auVar221._24_4_;
    auVar363._0_4_ =
         (float)local_b00._0_4_ * fVar270 +
         (float)local_860._0_4_ * fVar235 + fVar335 * (float)local_920._0_4_;
    auVar363._4_4_ =
         (float)local_b00._4_4_ * fVar306 +
         (float)local_860._4_4_ * fVar302 + fVar340 * (float)local_920._4_4_;
    auVar363._8_4_ = fStack_af8 * fVar266 + fStack_858 * fVar264 + fVar341 * fStack_918;
    auVar363._12_4_ = fStack_af4 * fVar238 + fStack_854 * fVar236 + fVar342 * fStack_914;
    auVar363._16_4_ = fStack_af0 * fVar269 + fStack_850 * fVar267 + fVar343 * fStack_910;
    auVar363._20_4_ = fStack_aec * fVar303 + fStack_84c * fVar299 + fVar344 * fStack_90c;
    auVar363._24_4_ = fStack_ae8 * fVar329 + fStack_848 * fVar328 + fVar345 * fStack_908;
    auVar363._28_4_ = fVar372 + auVar96._28_4_ + auVar204._28_4_;
    auVar377._0_4_ = fVar270 * fVar270 + fVar235 * fVar235 + fVar335 * fVar335;
    auVar377._4_4_ = fVar306 * fVar306 + fVar302 * fVar302 + fVar340 * fVar340;
    auVar377._8_4_ = fVar266 * fVar266 + fVar264 * fVar264 + fVar341 * fVar341;
    auVar377._12_4_ = fVar238 * fVar238 + fVar236 * fVar236 + fVar342 * fVar342;
    auVar377._16_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar343 * fVar343;
    auVar377._20_4_ = fVar303 * fVar303 + fVar299 * fVar299 + fVar344 * fVar344;
    auVar377._24_4_ = fVar329 * fVar329 + fVar328 * fVar328 + fVar345 * fVar345;
    auVar377._28_4_ = local_300._28_4_ + local_300._28_4_ + fVar372;
    local_5a0._0_4_ =
         (float)local_b00._0_4_ * fVar231 * local_640 +
         local_640 * fVar228 * (float)local_860._0_4_ + fVar229 * local_640 * (float)local_920._0_4_
    ;
    local_5a0._4_4_ =
         (float)local_b00._4_4_ * fVar294 * fStack_63c +
         fStack_63c * fVar286 * (float)local_860._4_4_ +
         fVar290 * fStack_63c * (float)local_920._4_4_;
    local_5a0._8_4_ =
         fStack_af8 * fVar260 * fStack_638 +
         fStack_638 * fVar237 * fStack_858 + fVar258 * fStack_638 * fStack_918;
    local_5a0._12_4_ =
         fStack_af4 * fVar232 * fStack_634 +
         fStack_634 * fVar268 * fStack_854 + fVar230 * fStack_634 * fStack_914;
    local_5a0._16_4_ =
         fStack_af0 * fVar263 * fStack_630 +
         fStack_630 * fVar259 * fStack_850 + fVar261 * fStack_630 * fStack_910;
    local_5a0._20_4_ =
         fStack_aec * fVar291 * fStack_62c +
         fStack_62c * fVar271 * fStack_84c + fVar287 * fStack_62c * fStack_90c;
    local_5a0._24_4_ =
         fStack_ae8 * fVar18 * fStack_628 +
         fStack_628 * fVar307 * fStack_848 + fVar17 * fStack_628 * fStack_908;
    local_5a0._28_4_ = fStack_ae4 + fStack_844 + fStack_904;
    fVar227 = fStack_ae4 + fStack_844 + fStack_904;
    local_660._0_4_ =
         fVar270 * fVar231 * local_640 +
         local_640 * fVar228 * fVar235 + fVar335 * fVar229 * local_640;
    local_660._4_4_ =
         fVar306 * fVar294 * fStack_63c +
         fStack_63c * fVar286 * fVar302 + fVar340 * fVar290 * fStack_63c;
    local_660._8_4_ =
         fVar266 * fVar260 * fStack_638 +
         fStack_638 * fVar237 * fVar264 + fVar341 * fVar258 * fStack_638;
    local_660._12_4_ =
         fVar238 * fVar232 * fStack_634 +
         fStack_634 * fVar268 * fVar236 + fVar342 * fVar230 * fStack_634;
    local_660._16_4_ =
         fVar269 * fVar263 * fStack_630 +
         fStack_630 * fVar259 * fVar267 + fVar343 * fVar261 * fStack_630;
    local_660._20_4_ =
         fVar303 * fVar291 * fStack_62c +
         fStack_62c * fVar271 * fVar299 + fVar344 * fVar287 * fStack_62c;
    local_660._24_4_ =
         fVar329 * fVar18 * fStack_628 +
         fStack_628 * fVar307 * fVar328 + fVar345 * fVar17 * fStack_628;
    local_660._28_4_ = fStack_844 + fVar227;
    auVar40._4_4_ = local_5a0._4_4_ * local_660._4_4_;
    auVar40._0_4_ = local_5a0._0_4_ * local_660._0_4_;
    auVar40._8_4_ = local_5a0._8_4_ * local_660._8_4_;
    auVar40._12_4_ = local_5a0._12_4_ * local_660._12_4_;
    auVar40._16_4_ = local_5a0._16_4_ * local_660._16_4_;
    auVar40._20_4_ = local_5a0._20_4_ * local_660._20_4_;
    auVar40._24_4_ = local_5a0._24_4_ * local_660._24_4_;
    auVar40._28_4_ = fVar227;
    auVar221 = vsubps_avx(auVar363,auVar40);
    auVar41._4_4_ = local_660._4_4_ * local_660._4_4_;
    auVar41._0_4_ = local_660._0_4_ * local_660._0_4_;
    auVar41._8_4_ = local_660._8_4_ * local_660._8_4_;
    auVar41._12_4_ = local_660._12_4_ * local_660._12_4_;
    auVar41._16_4_ = local_660._16_4_ * local_660._16_4_;
    auVar41._20_4_ = local_660._20_4_ * local_660._20_4_;
    auVar41._24_4_ = local_660._24_4_ * local_660._24_4_;
    auVar41._28_4_ = fStack_844;
    auVar20 = vsubps_avx(auVar377,auVar41);
    local_2e0 = vsqrtps_avx(auVar94);
    fVar227 = (local_2e0._0_4_ + auVar106._0_4_) * 1.0000002;
    fVar372 = (local_2e0._4_4_ + auVar106._4_4_) * 1.0000002;
    fVar175 = (local_2e0._8_4_ + auVar106._8_4_) * 1.0000002;
    fVar176 = (local_2e0._12_4_ + auVar106._12_4_) * 1.0000002;
    fVar178 = (local_2e0._16_4_ + auVar106._16_4_) * 1.0000002;
    fVar180 = (local_2e0._20_4_ + auVar106._20_4_) * 1.0000002;
    fVar182 = (local_2e0._24_4_ + auVar106._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar372 * fVar372;
    auVar42._0_4_ = fVar227 * fVar227;
    auVar42._8_4_ = fVar175 * fVar175;
    auVar42._12_4_ = fVar176 * fVar176;
    auVar42._16_4_ = fVar178 * fVar178;
    auVar42._20_4_ = fVar180 * fVar180;
    auVar42._24_4_ = fVar182 * fVar182;
    auVar42._28_4_ = local_2e0._28_4_ + auVar106._28_4_;
    local_a60._0_4_ = auVar221._0_4_ + auVar221._0_4_;
    local_a60._4_4_ = auVar221._4_4_ + auVar221._4_4_;
    local_a60._8_4_ = auVar221._8_4_ + auVar221._8_4_;
    local_a60._12_4_ = auVar221._12_4_ + auVar221._12_4_;
    local_a60._16_4_ = auVar221._16_4_ + auVar221._16_4_;
    local_a60._20_4_ = auVar221._20_4_ + auVar221._20_4_;
    local_a60._24_4_ = auVar221._24_4_ + auVar221._24_4_;
    fVar227 = auVar221._28_4_;
    local_a60._28_4_ = fVar227 + fVar227;
    auVar106 = vsubps_avx(auVar20,auVar42);
    auVar43._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
    auVar43._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
    auVar43._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar43._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar43._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar43._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar43._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar43._28_4_ = fVar227;
    auVar221 = vsubps_avx(local_2c0,auVar43);
    auVar44._4_4_ = local_a60._4_4_ * local_a60._4_4_;
    auVar44._0_4_ = (float)local_a60._0_4_ * (float)local_a60._0_4_;
    auVar44._8_4_ = local_a60._8_4_ * local_a60._8_4_;
    auVar44._12_4_ = local_a60._12_4_ * local_a60._12_4_;
    auVar44._16_4_ = local_a60._16_4_ * local_a60._16_4_;
    auVar44._20_4_ = local_a60._20_4_ * local_a60._20_4_;
    auVar44._24_4_ = local_a60._24_4_ * local_a60._24_4_;
    auVar44._28_4_ = local_2c0._28_4_;
    fVar227 = auVar221._0_4_;
    fVar372 = auVar221._4_4_;
    fVar175 = auVar221._8_4_;
    fVar176 = auVar221._12_4_;
    fVar178 = auVar221._16_4_;
    fStack_830 = fVar178 * 4.0;
    fVar180 = auVar221._20_4_;
    fStack_82c = fVar180 * 4.0;
    fVar182 = auVar221._24_4_;
    fStack_828 = fVar182 * 4.0;
    uStack_824 = 0x40800000;
    auVar45._4_4_ = auVar106._4_4_ * fVar372 * 4.0;
    auVar45._0_4_ = auVar106._0_4_ * fVar227 * 4.0;
    auVar45._8_4_ = auVar106._8_4_ * fVar175 * 4.0;
    auVar45._12_4_ = auVar106._12_4_ * fVar176 * 4.0;
    auVar45._16_4_ = auVar106._16_4_ * fStack_830;
    auVar45._20_4_ = auVar106._20_4_ * fStack_82c;
    auVar45._24_4_ = auVar106._24_4_ * fStack_828;
    auVar45._28_4_ = 0x40800000;
    auVar21 = vsubps_avx(auVar44,auVar45);
    auVar94 = vcmpps_avx(auVar21,auVar95,5);
    auVar101._8_4_ = 0x7fffffff;
    auVar101._0_8_ = 0x7fffffff7fffffff;
    auVar101._12_4_ = 0x7fffffff;
    auVar101._16_4_ = 0x7fffffff;
    auVar101._20_4_ = 0x7fffffff;
    auVar101._24_4_ = 0x7fffffff;
    auVar101._28_4_ = 0x7fffffff;
    local_460 = vandps_avx(auVar43,auVar101);
    local_360._0_4_ = fVar227 + fVar227;
    local_360._4_4_ = fVar372 + fVar372;
    local_360._8_4_ = fVar175 + fVar175;
    local_360._12_4_ = fVar176 + fVar176;
    local_360._16_4_ = fVar178 + fVar178;
    local_360._20_4_ = fVar180 + fVar180;
    local_360._24_4_ = fVar182 + fVar182;
    local_360._28_4_ = auVar221._28_4_ + auVar221._28_4_;
    local_a40 = vandps_avx(auVar221,auVar101);
    uVar78 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
    local_340._0_8_ = uVar78 ^ 0x8000000080000000;
    local_340._8_4_ = -local_a60._8_4_;
    local_340._12_4_ = -local_a60._12_4_;
    local_340._16_4_ = -local_a60._16_4_;
    local_340._20_4_ = -local_a60._20_4_;
    local_340._24_4_ = -local_a60._24_4_;
    local_340._28_4_ = -local_a60._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      local_9c0._8_4_ = 0x7f800000;
      local_9c0._0_8_ = 0x7f8000007f800000;
      local_9c0._12_4_ = 0x7f800000;
      local_9c0._16_4_ = 0x7f800000;
      local_9c0._20_4_ = 0x7f800000;
      local_9c0._24_4_ = 0x7f800000;
      local_9c0._28_4_ = 0x7f800000;
      auVar167._8_4_ = 0xff800000;
      auVar167._0_8_ = 0xff800000ff800000;
      auVar167._12_4_ = 0xff800000;
      auVar167._16_4_ = 0xff800000;
      auVar167._20_4_ = 0xff800000;
      auVar167._24_4_ = 0xff800000;
      auVar167._28_4_ = 0xff800000;
    }
    else {
      auVar97 = vsqrtps_avx(auVar21);
      auVar96 = vrcpps_avx(local_360);
      auVar221 = vcmpps_avx(auVar21,auVar95,5);
      fVar178 = auVar96._0_4_;
      fVar180 = auVar96._4_4_;
      auVar46._4_4_ = local_360._4_4_ * fVar180;
      auVar46._0_4_ = local_360._0_4_ * fVar178;
      fVar182 = auVar96._8_4_;
      auVar46._8_4_ = local_360._8_4_ * fVar182;
      fVar177 = auVar96._12_4_;
      auVar46._12_4_ = local_360._12_4_ * fVar177;
      fVar179 = auVar96._16_4_;
      auVar46._16_4_ = local_360._16_4_ * fVar179;
      fVar181 = auVar96._20_4_;
      auVar46._20_4_ = local_360._20_4_ * fVar181;
      fVar183 = auVar96._24_4_;
      auVar46._24_4_ = local_360._24_4_ * fVar183;
      auVar46._28_4_ = auVar21._28_4_;
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar102,auVar46);
      fVar178 = fVar178 + fVar178 * auVar21._0_4_;
      fVar180 = fVar180 + fVar180 * auVar21._4_4_;
      fVar182 = fVar182 + fVar182 * auVar21._8_4_;
      fVar177 = fVar177 + fVar177 * auVar21._12_4_;
      fVar179 = fVar179 + fVar179 * auVar21._16_4_;
      fVar181 = fVar181 + fVar181 * auVar21._20_4_;
      fVar183 = fVar183 + fVar183 * auVar21._24_4_;
      auVar95 = vsubps_avx(local_340,auVar97);
      fVar273 = auVar95._0_4_ * fVar178;
      fVar289 = auVar95._4_4_ * fVar180;
      auVar47._4_4_ = fVar289;
      auVar47._0_4_ = fVar273;
      fVar293 = auVar95._8_4_ * fVar182;
      auVar47._8_4_ = fVar293;
      fVar297 = auVar95._12_4_ * fVar177;
      auVar47._12_4_ = fVar297;
      fVar301 = auVar95._16_4_ * fVar179;
      auVar47._16_4_ = fVar301;
      fVar305 = auVar95._20_4_ * fVar181;
      auVar47._20_4_ = fVar305;
      fVar309 = auVar95._24_4_ * fVar183;
      auVar47._24_4_ = fVar309;
      auVar47._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(auVar97,local_a60);
      fVar178 = auVar95._0_4_ * fVar178;
      fVar180 = auVar95._4_4_ * fVar180;
      auVar48._4_4_ = fVar180;
      auVar48._0_4_ = fVar178;
      fVar182 = auVar95._8_4_ * fVar182;
      auVar48._8_4_ = fVar182;
      fVar177 = auVar95._12_4_ * fVar177;
      auVar48._12_4_ = fVar177;
      fVar179 = auVar95._16_4_ * fVar179;
      auVar48._16_4_ = fVar179;
      fVar181 = auVar95._20_4_ * fVar181;
      auVar48._20_4_ = fVar181;
      fVar183 = auVar95._24_4_ * fVar183;
      auVar48._24_4_ = fVar183;
      auVar48._28_4_ = auVar96._28_4_ + auVar21._28_4_;
      fStack_424 = local_660._28_4_ + auVar95._28_4_;
      local_440 = local_640 * (local_660._0_4_ + local_5a0._0_4_ * fVar273);
      fStack_43c = fStack_63c * (local_660._4_4_ + local_5a0._4_4_ * fVar289);
      fStack_438 = fStack_638 * (local_660._8_4_ + local_5a0._8_4_ * fVar293);
      fStack_434 = fStack_634 * (local_660._12_4_ + local_5a0._12_4_ * fVar297);
      fStack_430 = fStack_630 * (local_660._16_4_ + local_5a0._16_4_ * fVar301);
      fStack_42c = fStack_62c * (local_660._20_4_ + local_5a0._20_4_ * fVar305);
      fStack_428 = fStack_628 * (local_660._24_4_ + local_5a0._24_4_ * fVar309);
      local_420 = local_640 * (local_660._0_4_ + local_5a0._0_4_ * fVar178);
      fStack_41c = fStack_63c * (local_660._4_4_ + local_5a0._4_4_ * fVar180);
      fStack_418 = fStack_638 * (local_660._8_4_ + local_5a0._8_4_ * fVar182);
      fStack_414 = fStack_634 * (local_660._12_4_ + local_5a0._12_4_ * fVar177);
      fStack_410 = fStack_630 * (local_660._16_4_ + local_5a0._16_4_ * fVar179);
      fStack_40c = fStack_62c * (local_660._20_4_ + local_5a0._20_4_ * fVar181);
      fStack_408 = fStack_628 * (local_660._24_4_ + local_5a0._24_4_ * fVar183);
      fStack_404 = local_660._28_4_ + fStack_424;
      auVar249._8_4_ = 0x7f800000;
      auVar249._0_8_ = 0x7f8000007f800000;
      auVar249._12_4_ = 0x7f800000;
      auVar249._16_4_ = 0x7f800000;
      auVar249._20_4_ = 0x7f800000;
      auVar249._24_4_ = 0x7f800000;
      auVar249._28_4_ = 0x7f800000;
      local_9c0 = vblendvps_avx(auVar249,auVar47,auVar221);
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
      auVar167 = vblendvps_avx(auVar250,auVar48,auVar221);
      auVar21 = vmaxps_avx(local_5e0,local_460);
      auVar49._4_4_ = auVar21._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar21._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar21._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar21._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar21._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar21._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar21._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar21._28_4_;
      auVar21 = vcmpps_avx(local_a40,auVar49,1);
      auVar95 = auVar221 & auVar21;
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0x7f,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar95 >> 0xbf,0) != '\0') ||
          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar95[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar21,auVar221);
        auVar190 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar21 = vcmpps_avx(auVar106,_DAT_01f7b000,2);
        auVar334._8_4_ = 0xff800000;
        auVar334._0_8_ = 0xff800000ff800000;
        auVar334._12_4_ = 0xff800000;
        auVar334._16_4_ = 0xff800000;
        auVar334._20_4_ = 0xff800000;
        auVar334._24_4_ = 0xff800000;
        auVar334._28_4_ = 0xff800000;
        auVar365._8_4_ = 0x7f800000;
        auVar365._0_8_ = 0x7f8000007f800000;
        auVar365._12_4_ = 0x7f800000;
        auVar365._16_4_ = 0x7f800000;
        auVar365._20_4_ = 0x7f800000;
        auVar365._24_4_ = 0x7f800000;
        auVar365._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar365,auVar334,auVar21);
        auVar275 = vpmovsxwd_avx(auVar190);
        auVar190 = vpunpckhwd_avx(auVar190,auVar190);
        auVar284._16_16_ = auVar190;
        auVar284._0_16_ = auVar275;
        local_9c0 = vblendvps_avx(local_9c0,auVar106,auVar284);
        auVar106 = vblendvps_avx(auVar334,auVar365,auVar21);
        auVar167 = vblendvps_avx(auVar167,auVar106,auVar284);
        auVar257._0_8_ = auVar94._0_8_ ^ 0xffffffffffffffff;
        auVar257._8_4_ = auVar94._8_4_ ^ 0xffffffff;
        auVar257._12_4_ = auVar94._12_4_ ^ 0xffffffff;
        auVar257._16_4_ = auVar94._16_4_ ^ 0xffffffff;
        auVar257._20_4_ = auVar94._20_4_ ^ 0xffffffff;
        auVar257._24_4_ = auVar94._24_4_ ^ 0xffffffff;
        auVar257._28_4_ = auVar94._28_4_ ^ 0xffffffff;
        auVar94 = vorps_avx(auVar21,auVar257);
        auVar94 = vandps_avx(auVar221,auVar94);
      }
    }
    auVar393 = ZEXT3264(local_9e0);
    auVar353 = ZEXT3264(local_b80);
    auVar106 = local_540 & auVar94;
    auVar285 = ZEXT3264(local_a20);
    fVar178 = (float)local_940._0_4_;
    fVar180 = (float)local_940._4_4_;
    fVar182 = fStack_938;
    fVar177 = fStack_934;
    fVar179 = fStack_930;
    fVar181 = fStack_92c;
    fVar183 = fStack_928;
    fVar273 = fStack_924;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      auVar339 = ZEXT3264(local_aa0);
    }
    else {
      fStack_624 = auVar10._28_4_ + auVar204._28_4_;
      auVar393 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar190 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_980._0_4_));
      auVar190 = vshufps_avx(auVar190,auVar190,0);
      auVar251._16_16_ = auVar190;
      auVar251._0_16_ = auVar190;
      auVar21 = vminps_avx(auVar251,auVar167);
      auVar103._0_4_ =
           (float)local_b00._0_4_ * fVar360 +
           (float)local_860._0_4_ * fVar346 + (float)local_920._0_4_ * fVar373;
      auVar103._4_4_ =
           (float)local_b00._4_4_ * fVar366 +
           (float)local_860._4_4_ * fVar354 + (float)local_920._4_4_ * fVar378;
      auVar103._8_4_ = fStack_af8 * fVar367 + fStack_858 * fVar355 + fStack_918 * fVar380;
      auVar103._12_4_ = fStack_af4 * fVar368 + fStack_854 * fVar356 + fStack_914 * fVar382;
      auVar103._16_4_ = fStack_af0 * fVar369 + fStack_850 * fVar357 + fStack_910 * fVar384;
      auVar103._20_4_ = fStack_aec * fVar370 + fStack_84c * fVar358 + fStack_90c * fVar386;
      auVar103._24_4_ = fStack_ae8 * fVar371 + fStack_848 * fVar359 + fStack_908 * fVar388;
      auVar103._28_4_ = fVar390 + auVar348._28_4_ + fVar390;
      auVar221 = vrcpps_avx(auVar103);
      fVar390 = auVar221._0_4_;
      fVar289 = auVar221._4_4_;
      auVar50._4_4_ = auVar103._4_4_ * fVar289;
      auVar50._0_4_ = auVar103._0_4_ * fVar390;
      fVar293 = auVar221._8_4_;
      auVar50._8_4_ = auVar103._8_4_ * fVar293;
      fVar297 = auVar221._12_4_;
      auVar50._12_4_ = auVar103._12_4_ * fVar297;
      fVar301 = auVar221._16_4_;
      auVar50._16_4_ = auVar103._16_4_ * fVar301;
      fVar305 = auVar221._20_4_;
      auVar50._20_4_ = auVar103._20_4_ * fVar305;
      fVar309 = auVar221._24_4_;
      auVar50._24_4_ = auVar103._24_4_ * fVar309;
      auVar50._28_4_ = auVar94._28_4_ + auVar190._12_4_;
      auVar338._8_4_ = 0x3f800000;
      auVar338._0_8_ = 0x3f8000003f800000;
      auVar338._12_4_ = 0x3f800000;
      auVar338._16_4_ = 0x3f800000;
      auVar338._20_4_ = 0x3f800000;
      auVar338._24_4_ = 0x3f800000;
      auVar338._28_4_ = 0x3f800000;
      auVar95 = vsubps_avx(auVar338,auVar50);
      auVar282._8_4_ = 0x7fffffff;
      auVar282._0_8_ = 0x7fffffff7fffffff;
      auVar282._12_4_ = 0x7fffffff;
      auVar282._16_4_ = 0x7fffffff;
      auVar282._20_4_ = 0x7fffffff;
      auVar282._24_4_ = 0x7fffffff;
      auVar282._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar103,auVar282);
      auVar318._8_4_ = 0x219392ef;
      auVar318._0_8_ = 0x219392ef219392ef;
      auVar318._12_4_ = 0x219392ef;
      auVar318._16_4_ = 0x219392ef;
      auVar318._20_4_ = 0x219392ef;
      auVar318._24_4_ = 0x219392ef;
      auVar318._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar106,auVar318,1);
      auVar51._4_4_ =
           (fVar289 + fVar289 * auVar95._4_4_) *
           -(fVar306 * fVar366 + fVar354 * fVar302 + fVar340 * fVar378);
      auVar51._0_4_ =
           (fVar390 + fVar390 * auVar95._0_4_) *
           -(fVar270 * fVar360 + fVar346 * fVar235 + fVar335 * fVar373);
      auVar51._8_4_ =
           (fVar293 + fVar293 * auVar95._8_4_) *
           -(fVar266 * fVar367 + fVar355 * fVar264 + fVar341 * fVar380);
      auVar51._12_4_ =
           (fVar297 + fVar297 * auVar95._12_4_) *
           -(fVar238 * fVar368 + fVar356 * fVar236 + fVar342 * fVar382);
      auVar51._16_4_ =
           (fVar301 + fVar301 * auVar95._16_4_) *
           -(fVar269 * fVar369 + fVar357 * fVar267 + fVar343 * fVar384);
      auVar51._20_4_ =
           (fVar305 + fVar305 * auVar95._20_4_) *
           -(fVar303 * fVar370 + fVar358 * fVar299 + fVar344 * fVar386);
      auVar51._24_4_ =
           (fVar309 + fVar309 * auVar95._24_4_) *
           -(fVar329 * fVar371 + fVar359 * fVar328 + fVar345 * fVar388);
      auVar51._28_4_ = auVar221._28_4_ + auVar95._28_4_;
      auVar106 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,1);
      auVar106 = vorps_avx(auVar10,auVar106);
      auVar333._8_4_ = 0xff800000;
      auVar333._0_8_ = 0xff800000ff800000;
      auVar333._12_4_ = 0xff800000;
      auVar333._16_4_ = 0xff800000;
      auVar333._20_4_ = 0xff800000;
      auVar333._24_4_ = 0xff800000;
      auVar333._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar51,auVar333,auVar106);
      auVar221 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,6);
      auVar10 = vorps_avx(auVar10,auVar221);
      auVar364._8_4_ = 0x7f800000;
      auVar364._0_8_ = 0x7f8000007f800000;
      auVar364._12_4_ = 0x7f800000;
      auVar364._16_4_ = 0x7f800000;
      auVar364._20_4_ = 0x7f800000;
      auVar364._24_4_ = 0x7f800000;
      auVar364._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar51,auVar364,auVar10);
      auVar221 = vmaxps_avx(local_3e0,local_9c0);
      auVar221 = vmaxps_avx(auVar221,auVar106);
      auVar21 = vminps_avx(auVar21,auVar10);
      auVar95 = ZEXT832(0) << 0x20;
      auVar106 = vsubps_avx(auVar95,auVar11);
      auVar10 = vsubps_avx(auVar95,auVar12);
      auVar52._4_4_ = auVar10._4_4_ * -fVar117;
      auVar52._0_4_ = auVar10._0_4_ * -fVar85;
      auVar52._8_4_ = auVar10._8_4_ * -fVar119;
      auVar52._12_4_ = auVar10._12_4_ * -fVar121;
      auVar52._16_4_ = auVar10._16_4_ * -fVar122;
      auVar52._20_4_ = auVar10._20_4_ * -fVar123;
      auVar52._24_4_ = auVar10._24_4_ * -fVar124;
      auVar52._28_4_ = auVar10._28_4_;
      auVar53._4_4_ = fVar298 * auVar106._4_4_;
      auVar53._0_4_ = fVar233 * auVar106._0_4_;
      auVar53._8_4_ = fVar262 * auVar106._8_4_;
      auVar53._12_4_ = fVar234 * auVar106._12_4_;
      auVar53._16_4_ = fVar265 * auVar106._16_4_;
      auVar53._20_4_ = fVar295 * auVar106._20_4_;
      auVar53._24_4_ = fVar396 * auVar106._24_4_;
      auVar53._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar52,auVar53);
      auVar10 = vsubps_avx(auVar95,auVar14);
      auVar54._4_4_ = fVar379 * auVar10._4_4_;
      auVar54._0_4_ = fVar374 * auVar10._0_4_;
      auVar54._8_4_ = fVar381 * auVar10._8_4_;
      auVar54._12_4_ = fVar383 * auVar10._12_4_;
      auVar54._16_4_ = fVar385 * auVar10._16_4_;
      auVar54._20_4_ = fVar387 * auVar10._20_4_;
      uVar1 = auVar10._28_4_;
      auVar54._24_4_ = fVar389 * auVar10._24_4_;
      auVar54._28_4_ = uVar1;
      auVar11 = vsubps_avx(auVar106,auVar54);
      auVar55._4_4_ = (float)local_920._4_4_ * -fVar117;
      auVar55._0_4_ = (float)local_920._0_4_ * -fVar85;
      auVar55._8_4_ = fStack_918 * -fVar119;
      auVar55._12_4_ = fStack_914 * -fVar121;
      auVar55._16_4_ = fStack_910 * -fVar122;
      auVar55._20_4_ = fStack_90c * -fVar123;
      auVar55._24_4_ = fStack_908 * -fVar124;
      auVar55._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar56._4_4_ = (float)local_860._4_4_ * fVar298;
      auVar56._0_4_ = (float)local_860._0_4_ * fVar233;
      auVar56._8_4_ = fStack_858 * fVar262;
      auVar56._12_4_ = fStack_854 * fVar234;
      auVar56._16_4_ = fStack_850 * fVar265;
      auVar56._20_4_ = fStack_84c * fVar295;
      auVar56._24_4_ = fStack_848 * fVar396;
      auVar56._28_4_ = uVar1;
      auVar349._8_4_ = 0x3f800000;
      auVar349._0_8_ = 0x3f8000003f800000;
      auVar349._12_4_ = 0x3f800000;
      auVar349._16_4_ = 0x3f800000;
      auVar349._20_4_ = 0x3f800000;
      auVar349._24_4_ = 0x3f800000;
      auVar349._28_4_ = 0x3f800000;
      auVar106 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = (float)local_b00._4_4_ * fVar379;
      auVar57._0_4_ = (float)local_b00._0_4_ * fVar374;
      auVar57._8_4_ = fStack_af8 * fVar381;
      auVar57._12_4_ = fStack_af4 * fVar383;
      auVar57._16_4_ = fStack_af0 * fVar385;
      auVar57._20_4_ = fStack_aec * fVar387;
      auVar57._24_4_ = fStack_ae8 * fVar389;
      auVar57._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar106,auVar57);
      auVar106 = vrcpps_avx(auVar12);
      fVar233 = auVar106._0_4_;
      auVar252._0_4_ = auVar12._0_4_ * fVar233;
      fVar235 = auVar106._4_4_;
      auVar252._4_4_ = auVar12._4_4_ * fVar235;
      fVar270 = auVar106._8_4_;
      auVar252._8_4_ = auVar12._8_4_ * fVar270;
      fVar298 = auVar106._12_4_;
      auVar252._12_4_ = auVar12._12_4_ * fVar298;
      fVar302 = auVar106._16_4_;
      auVar252._16_4_ = auVar12._16_4_ * fVar302;
      fVar306 = auVar106._20_4_;
      auVar252._20_4_ = auVar12._20_4_ * fVar306;
      fVar262 = auVar106._24_4_;
      auVar252._24_4_ = auVar12._24_4_ * fVar262;
      auVar252._28_4_ = 0;
      auVar14 = vsubps_avx(auVar349,auVar252);
      auVar104._8_4_ = 0x7fffffff;
      auVar104._0_8_ = 0x7fffffff7fffffff;
      auVar104._12_4_ = 0x7fffffff;
      auVar104._16_4_ = 0x7fffffff;
      auVar104._20_4_ = 0x7fffffff;
      auVar104._24_4_ = 0x7fffffff;
      auVar104._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar12,auVar104);
      auVar10 = vcmpps_avx(auVar106,auVar318,1);
      auVar58._4_4_ = (fVar235 + fVar235 * auVar14._4_4_) * -auVar11._4_4_;
      auVar58._0_4_ = (fVar233 + fVar233 * auVar14._0_4_) * -auVar11._0_4_;
      auVar58._8_4_ = (fVar270 + fVar270 * auVar14._8_4_) * -auVar11._8_4_;
      auVar58._12_4_ = (fVar298 + fVar298 * auVar14._12_4_) * -auVar11._12_4_;
      auVar58._16_4_ = (fVar302 + fVar302 * auVar14._16_4_) * -auVar11._16_4_;
      auVar58._20_4_ = (fVar306 + fVar306 * auVar14._20_4_) * -auVar11._20_4_;
      auVar58._24_4_ = (fVar262 + fVar262 * auVar14._24_4_) * -auVar11._24_4_;
      auVar58._28_4_ = auVar11._28_4_ ^ 0x80000000;
      auVar106 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,1);
      auVar106 = vorps_avx(auVar10,auVar106);
      auVar106 = vblendvps_avx(auVar58,auVar333,auVar106);
      local_880 = vmaxps_avx(auVar221,auVar106);
      auVar106 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,6);
      auVar106 = vorps_avx(auVar10,auVar106);
      auVar106 = vblendvps_avx(auVar58,auVar364,auVar106);
      auVar94 = vandps_avx(local_540,auVar94);
      local_480 = vminps_avx(auVar21,auVar106);
      auVar106 = vcmpps_avx(local_880,local_480,2);
      auVar10 = auVar94 & auVar106;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar10 = vminps_avx(auVar281,auVar166);
        auVar11 = vminps_avx(auVar13,auVar15);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar10 = vsubps_avx(auVar10,local_2e0);
        auVar94 = vandps_avx(auVar106,auVar94);
        auVar73._4_4_ = fStack_43c;
        auVar73._0_4_ = local_440;
        auVar73._8_4_ = fStack_438;
        auVar73._12_4_ = fStack_434;
        auVar73._16_4_ = fStack_430;
        auVar73._20_4_ = fStack_42c;
        auVar73._24_4_ = fStack_428;
        auVar73._28_4_ = fStack_424;
        auVar106 = vminps_avx(auVar73,auVar349);
        auVar218 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar84 + fVar125 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar116 + fVar154 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar118 + fVar155 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar120 + fVar156 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar84 + fVar125 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar116 + fVar154 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar118 + fVar155 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar120 + auVar106._28_4_ + 7.0;
        auVar74._4_4_ = fStack_41c;
        auVar74._0_4_ = local_420;
        auVar74._8_4_ = fStack_418;
        auVar74._12_4_ = fStack_414;
        auVar74._16_4_ = fStack_410;
        auVar74._20_4_ = fStack_40c;
        auVar74._24_4_ = fStack_408;
        auVar74._28_4_ = fStack_404;
        auVar106 = vminps_avx(auVar74,auVar349);
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar84 + fVar125 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar116 + fVar154 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar118 + fVar155 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar120 + fVar156 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar84 + fVar125 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar116 + fVar154 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar118 + fVar155 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar120 + auVar106._28_4_ + 7.0;
        auVar59._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar59._28_4_ = 0x3f7ffffc;
        auVar106 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
        auVar60._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar60._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar60._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar60._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar60._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar60._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar60._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar60._28_4_ = auVar106._28_4_;
        local_b40 = vsubps_avx(auVar20,auVar60);
        auVar61._4_4_ = local_b40._4_4_ * fVar372 * 4.0;
        auVar61._0_4_ = local_b40._0_4_ * fVar227 * 4.0;
        auVar61._8_4_ = local_b40._8_4_ * fVar175 * 4.0;
        auVar61._12_4_ = local_b40._12_4_ * fVar176 * 4.0;
        auVar61._16_4_ = local_b40._16_4_ * fStack_830;
        auVar61._20_4_ = local_b40._20_4_ * fStack_82c;
        auVar61._24_4_ = local_b40._24_4_ * fStack_828;
        auVar61._28_4_ = auVar106._28_4_;
        auVar10 = vsubps_avx(auVar44,auVar61);
        auVar106 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar278 = ZEXT828(0) << 0x20;
          auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar394 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_ba0 = ZEXT832(0) << 0x20;
          _local_d20 = local_ba0._0_28_;
          auVar319._8_4_ = 0x7f800000;
          auVar319._0_8_ = 0x7f8000007f800000;
          auVar319._12_4_ = 0x7f800000;
          auVar319._16_4_ = 0x7f800000;
          auVar319._20_4_ = 0x7f800000;
          auVar319._24_4_ = 0x7f800000;
          auVar319._28_4_ = 0x7f800000;
          auVar350._8_4_ = 0xff800000;
          auVar350._0_8_ = 0xff800000ff800000;
          auVar350._12_4_ = 0xff800000;
          auVar350._16_4_ = 0xff800000;
          auVar350._20_4_ = 0xff800000;
          auVar350._24_4_ = 0xff800000;
          auVar350._28_4_ = 0xff800000;
          local_b40 = auVar23;
        }
        else {
          auVar11 = vrcpps_avx(local_360);
          fVar227 = auVar11._0_4_;
          auVar222._0_4_ = local_360._0_4_ * fVar227;
          fVar233 = auVar11._4_4_;
          auVar222._4_4_ = local_360._4_4_ * fVar233;
          fVar235 = auVar11._8_4_;
          auVar222._8_4_ = local_360._8_4_ * fVar235;
          fVar270 = auVar11._12_4_;
          auVar222._12_4_ = local_360._12_4_ * fVar270;
          fVar298 = auVar11._16_4_;
          auVar222._16_4_ = local_360._16_4_ * fVar298;
          fVar302 = auVar11._20_4_;
          auVar222._20_4_ = local_360._20_4_ * fVar302;
          fVar306 = auVar11._24_4_;
          auVar222._24_4_ = local_360._24_4_ * fVar306;
          auVar222._28_4_ = 0;
          auVar13 = vsubps_avx(auVar349,auVar222);
          auVar12 = vsqrtps_avx(auVar10);
          fVar227 = fVar227 + fVar227 * auVar13._0_4_;
          fVar233 = fVar233 + fVar233 * auVar13._4_4_;
          fVar235 = fVar235 + fVar235 * auVar13._8_4_;
          fVar270 = fVar270 + fVar270 * auVar13._12_4_;
          fVar298 = fVar298 + fVar298 * auVar13._16_4_;
          fVar302 = fVar302 + fVar302 * auVar13._20_4_;
          fVar306 = fVar306 + fVar306 * auVar13._24_4_;
          auVar14 = vsubps_avx(local_340,auVar12);
          fVar267 = auVar14._0_4_ * fVar227;
          fVar269 = auVar14._4_4_ * fVar233;
          auVar62._4_4_ = fVar269;
          auVar62._0_4_ = fVar267;
          fVar295 = auVar14._8_4_ * fVar235;
          auVar62._8_4_ = fVar295;
          fVar299 = auVar14._12_4_ * fVar270;
          auVar62._12_4_ = fVar299;
          fVar303 = auVar14._16_4_ * fVar298;
          auVar62._16_4_ = fVar303;
          fVar396 = auVar14._20_4_ * fVar302;
          auVar62._20_4_ = fVar396;
          fVar328 = auVar14._24_4_ * fVar306;
          auVar62._24_4_ = fVar328;
          auVar62._28_4_ = fStack_904;
          auVar14 = vsubps_avx(auVar12,local_a60);
          fVar227 = auVar14._0_4_ * fVar227;
          fVar233 = auVar14._4_4_ * fVar233;
          auVar63._4_4_ = fVar233;
          auVar63._0_4_ = fVar227;
          fVar235 = auVar14._8_4_ * fVar235;
          auVar63._8_4_ = fVar235;
          fVar270 = auVar14._12_4_ * fVar270;
          auVar63._12_4_ = fVar270;
          fVar298 = auVar14._16_4_ * fVar298;
          auVar63._16_4_ = fVar298;
          fVar302 = auVar14._20_4_ * fVar302;
          auVar63._20_4_ = fVar302;
          fVar306 = auVar14._24_4_ * fVar306;
          auVar63._24_4_ = fVar306;
          auVar63._28_4_ = fVar156;
          fVar262 = (fVar267 * local_5a0._0_4_ + local_660._0_4_) * local_640;
          fVar264 = (fVar269 * local_5a0._4_4_ + local_660._4_4_) * fStack_63c;
          fVar266 = (fVar295 * local_5a0._8_4_ + local_660._8_4_) * fStack_638;
          fVar234 = (fVar299 * local_5a0._12_4_ + local_660._12_4_) * fStack_634;
          fVar236 = (fVar303 * local_5a0._16_4_ + local_660._16_4_) * fStack_630;
          fVar238 = (fVar396 * local_5a0._20_4_ + local_660._20_4_) * fStack_62c;
          fVar265 = (fVar328 * local_5a0._24_4_ + local_660._24_4_) * fStack_628;
          auVar168._0_4_ = fVar272 + fVar262 * fVar231;
          auVar168._4_4_ = fVar288 + fVar264 * fVar294;
          auVar168._8_4_ = fVar292 + fVar266 * fVar260;
          auVar168._12_4_ = fVar296 + fVar234 * fVar232;
          auVar168._16_4_ = fVar300 + fVar236 * fVar263;
          auVar168._20_4_ = fVar304 + fVar238 * fVar291;
          auVar168._24_4_ = fVar308 + fVar265 * fVar18;
          auVar168._28_4_ = fVar310 + auVar11._28_4_ + auVar13._28_4_ + local_660._28_4_;
          auVar64._4_4_ = fVar269 * (float)local_b00._4_4_;
          auVar64._0_4_ = fVar267 * (float)local_b00._0_4_;
          auVar64._8_4_ = fVar295 * fStack_af8;
          auVar64._12_4_ = fVar299 * fStack_af4;
          auVar64._16_4_ = fVar303 * fStack_af0;
          auVar64._20_4_ = fVar396 * fStack_aec;
          auVar64._24_4_ = fVar328 * fStack_ae8;
          auVar64._28_4_ = auVar12._28_4_;
          local_a00 = vsubps_avx(auVar64,auVar168);
          auVar253._0_4_ = (float)local_ae0._0_4_ + fVar262 * fVar228;
          auVar253._4_4_ = local_ae0._4_4_ + fVar264 * fVar286;
          auVar253._8_4_ = local_ae0._8_4_ + fVar266 * fVar237;
          auVar253._12_4_ = local_ae0._12_4_ + fVar234 * fVar268;
          auVar253._16_4_ = local_ae0._16_4_ + fVar236 * fVar259;
          auVar253._20_4_ = local_ae0._20_4_ + fVar238 * fVar271;
          auVar253._24_4_ = local_ae0._24_4_ + fVar265 * fVar307;
          auVar253._28_4_ = local_ae0._28_4_ + auVar12._28_4_;
          auVar65._4_4_ = (float)local_860._4_4_ * fVar269;
          auVar65._0_4_ = (float)local_860._0_4_ * fVar267;
          auVar65._8_4_ = fStack_858 * fVar295;
          auVar65._12_4_ = fStack_854 * fVar299;
          auVar65._16_4_ = fStack_850 * fVar303;
          auVar65._20_4_ = fStack_84c * fVar396;
          auVar65._24_4_ = fStack_848 * fVar328;
          auVar65._28_4_ = 0x3e000000;
          auVar11 = vsubps_avx(auVar65,auVar253);
          _local_d20 = auVar11._0_28_;
          auVar223._0_4_ = local_300._0_4_ + fVar229 * fVar262;
          auVar223._4_4_ = local_300._4_4_ + fVar290 * fVar264;
          auVar223._8_4_ = local_300._8_4_ + fVar258 * fVar266;
          auVar223._12_4_ = local_300._12_4_ + fVar230 * fVar234;
          auVar223._16_4_ = local_300._16_4_ + fVar261 * fVar236;
          auVar223._20_4_ = local_300._20_4_ + fVar287 * fVar238;
          auVar223._24_4_ = local_300._24_4_ + fVar17 * fVar265;
          auVar223._28_4_ = local_300._28_4_ + auVar14._28_4_;
          auVar66._4_4_ = fVar269 * (float)local_920._4_4_;
          auVar66._0_4_ = fVar267 * (float)local_920._0_4_;
          auVar66._8_4_ = fVar295 * fStack_918;
          auVar66._12_4_ = fVar299 * fStack_914;
          auVar66._16_4_ = fVar303 * fStack_910;
          auVar66._20_4_ = fVar396 * fStack_90c;
          auVar66._24_4_ = fVar328 * fStack_908;
          auVar66._28_4_ = auVar253._28_4_;
          _local_ba0 = vsubps_avx(auVar66,auVar223);
          fVar262 = (fVar227 * local_5a0._0_4_ + local_660._0_4_) * local_640;
          fVar264 = (fVar233 * local_5a0._4_4_ + local_660._4_4_) * fStack_63c;
          fVar266 = (fVar235 * local_5a0._8_4_ + local_660._8_4_) * fStack_638;
          fVar234 = (fVar270 * local_5a0._12_4_ + local_660._12_4_) * fStack_634;
          fVar236 = (fVar298 * local_5a0._16_4_ + local_660._16_4_) * fStack_630;
          fVar238 = (fVar302 * local_5a0._20_4_ + local_660._20_4_) * fStack_62c;
          fVar265 = (fVar306 * local_5a0._24_4_ + local_660._24_4_) * fStack_628;
          auVar224._0_4_ = fVar272 + fVar262 * fVar231;
          auVar224._4_4_ = fVar288 + fVar264 * fVar294;
          auVar224._8_4_ = fVar292 + fVar266 * fVar260;
          auVar224._12_4_ = fVar296 + fVar234 * fVar232;
          auVar224._16_4_ = fVar300 + fVar236 * fVar263;
          auVar224._20_4_ = fVar304 + fVar238 * fVar291;
          auVar224._24_4_ = fVar308 + fVar265 * fVar18;
          auVar224._28_4_ = fVar310 + local_ba0._28_4_ + local_660._28_4_;
          auVar67._4_4_ = fVar233 * (float)local_b00._4_4_;
          auVar67._0_4_ = fVar227 * (float)local_b00._0_4_;
          auVar67._8_4_ = fVar235 * fStack_af8;
          auVar67._12_4_ = fVar270 * fStack_af4;
          auVar67._16_4_ = fVar298 * fStack_af0;
          auVar67._20_4_ = fVar302 * fStack_aec;
          auVar67._24_4_ = fVar306 * fStack_ae8;
          auVar67._28_4_ = 0x3e000000;
          auVar11 = vsubps_avx(auVar67,auVar224);
          auVar218 = auVar11._0_28_;
          auVar283._0_4_ = (float)local_ae0._0_4_ + fVar262 * fVar228;
          auVar283._4_4_ = local_ae0._4_4_ + fVar264 * fVar286;
          auVar283._8_4_ = local_ae0._8_4_ + fVar266 * fVar237;
          auVar283._12_4_ = local_ae0._12_4_ + fVar234 * fVar268;
          auVar283._16_4_ = local_ae0._16_4_ + fVar236 * fVar259;
          auVar283._20_4_ = local_ae0._20_4_ + fVar238 * fVar271;
          auVar283._24_4_ = local_ae0._24_4_ + fVar265 * fVar307;
          auVar283._28_4_ = local_ae0._28_4_ + 0.125;
          auVar68._4_4_ = (float)local_860._4_4_ * fVar233;
          auVar68._0_4_ = (float)local_860._0_4_ * fVar227;
          auVar68._8_4_ = fStack_858 * fVar235;
          auVar68._12_4_ = fStack_854 * fVar270;
          auVar68._16_4_ = fStack_850 * fVar298;
          auVar68._20_4_ = fStack_84c * fVar302;
          auVar68._24_4_ = fStack_848 * fVar306;
          auVar68._28_4_ = fStack_ae4;
          auVar11 = vsubps_avx(auVar68,auVar283);
          auVar278 = auVar11._0_28_;
          auVar254._0_4_ = local_300._0_4_ + fVar229 * fVar262;
          auVar254._4_4_ = local_300._4_4_ + fVar290 * fVar264;
          auVar254._8_4_ = local_300._8_4_ + fVar258 * fVar266;
          auVar254._12_4_ = local_300._12_4_ + fVar230 * fVar234;
          auVar254._16_4_ = local_300._16_4_ + fVar261 * fVar236;
          auVar254._20_4_ = local_300._20_4_ + fVar287 * fVar238;
          auVar254._24_4_ = local_300._24_4_ + fVar17 * fVar265;
          auVar254._28_4_ = local_300._28_4_ + auVar253._28_4_;
          auVar69._4_4_ = fVar233 * (float)local_920._4_4_;
          auVar69._0_4_ = fVar227 * (float)local_920._0_4_;
          auVar69._8_4_ = fVar235 * fStack_918;
          auVar69._12_4_ = fVar270 * fStack_914;
          auVar69._16_4_ = fVar298 * fStack_910;
          auVar69._20_4_ = fVar302 * fStack_90c;
          auVar69._24_4_ = fVar306 * fStack_908;
          auVar69._28_4_ = fStack_ae4;
          auVar11 = vsubps_avx(auVar69,auVar254);
          auVar245 = auVar11._0_28_;
          auVar10 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
          auVar320._8_4_ = 0x7f800000;
          auVar320._0_8_ = 0x7f8000007f800000;
          auVar320._12_4_ = 0x7f800000;
          auVar320._16_4_ = 0x7f800000;
          auVar320._20_4_ = 0x7f800000;
          auVar320._24_4_ = 0x7f800000;
          auVar320._28_4_ = 0x7f800000;
          auVar319 = vblendvps_avx(auVar320,auVar62,auVar10);
          auVar11 = vmaxps_avx(local_5e0,local_460);
          auVar70._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar70._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar70._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar70._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar70._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar70._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar70._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar70._28_4_ = auVar11._28_4_;
          auVar11 = vcmpps_avx(local_a40,auVar70,1);
          auVar351._8_4_ = 0xff800000;
          auVar351._0_8_ = 0xff800000ff800000;
          auVar351._12_4_ = 0xff800000;
          auVar351._16_4_ = 0xff800000;
          auVar351._20_4_ = 0xff800000;
          auVar351._24_4_ = 0xff800000;
          auVar351._28_4_ = 0xff800000;
          auVar350 = vblendvps_avx(auVar351,auVar63,auVar10);
          auVar12 = auVar10 & auVar11;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar106 = vandps_avx(auVar11,auVar10);
            auVar190 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar12 = vcmpps_avx(local_b40,_DAT_01f7b000,2);
            auVar153._8_4_ = 0xff800000;
            auVar153._0_8_ = 0xff800000ff800000;
            auVar153._12_4_ = 0xff800000;
            auVar153._16_4_ = 0xff800000;
            auVar153._20_4_ = 0xff800000;
            auVar153._24_4_ = 0xff800000;
            auVar153._28_4_ = 0xff800000;
            auVar174._8_4_ = 0x7f800000;
            auVar174._0_8_ = 0x7f8000007f800000;
            auVar174._12_4_ = 0x7f800000;
            auVar174._16_4_ = 0x7f800000;
            auVar174._20_4_ = 0x7f800000;
            auVar174._24_4_ = 0x7f800000;
            auVar174._28_4_ = 0x7f800000;
            auVar11 = vblendvps_avx(auVar174,auVar153,auVar12);
            auVar275 = vpmovsxwd_avx(auVar190);
            auVar190 = vpunpckhwd_avx(auVar190,auVar190);
            auVar392._16_16_ = auVar190;
            auVar392._0_16_ = auVar275;
            auVar319 = vblendvps_avx(auVar319,auVar11,auVar392);
            auVar11 = vblendvps_avx(auVar153,auVar174,auVar12);
            auVar350 = vblendvps_avx(auVar350,auVar11,auVar392);
            auVar206._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
            auVar206._8_4_ = auVar106._8_4_ ^ 0xffffffff;
            auVar206._12_4_ = auVar106._12_4_ ^ 0xffffffff;
            auVar206._16_4_ = auVar106._16_4_ ^ 0xffffffff;
            auVar206._20_4_ = auVar106._20_4_ ^ 0xffffffff;
            auVar206._24_4_ = auVar106._24_4_ ^ 0xffffffff;
            auVar206._28_4_ = auVar106._28_4_ ^ 0xffffffff;
            auVar106 = vorps_avx(auVar12,auVar206);
            auVar106 = vandps_avx(auVar10,auVar106);
          }
          auVar394 = local_a00._0_28_;
        }
        _local_4e0 = local_880;
        local_4c0 = vminps_avx(local_480,auVar319);
        _local_8c0 = vmaxps_avx(local_880,auVar350);
        _local_4a0 = _local_8c0;
        auVar10 = vcmpps_avx(local_880,local_4c0,2);
        local_7c0 = vandps_avx(auVar94,auVar10);
        auVar10 = vcmpps_avx(_local_8c0,local_480,2);
        local_900 = vandps_avx(auVar94,auVar10);
        auVar94 = vorps_avx(local_900,local_7c0);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          auStack_95c = auVar281._4_28_;
          auVar145._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
          auVar145._8_4_ = auVar106._8_4_ ^ 0xffffffff;
          auVar145._12_4_ = auVar106._12_4_ ^ 0xffffffff;
          auVar145._16_4_ = auVar106._16_4_ ^ 0xffffffff;
          auVar145._20_4_ = auVar106._20_4_ ^ 0xffffffff;
          auVar145._24_4_ = auVar106._24_4_ ^ 0xffffffff;
          fVar227 = auVar106._28_4_;
          auVar145._28_4_ = (uint)fVar227 ^ 0xffffffff;
          auVar107._0_4_ =
               (float)local_b00._0_4_ * auVar218._0_4_ +
               (float)local_860._0_4_ * auVar278._0_4_ + (float)local_920._0_4_ * auVar245._0_4_;
          auVar107._4_4_ =
               (float)local_b00._4_4_ * auVar218._4_4_ +
               (float)local_860._4_4_ * auVar278._4_4_ + (float)local_920._4_4_ * auVar245._4_4_;
          auVar107._8_4_ =
               fStack_af8 * auVar218._8_4_ +
               fStack_858 * auVar278._8_4_ + fStack_918 * auVar245._8_4_;
          auVar107._12_4_ =
               fStack_af4 * auVar218._12_4_ +
               fStack_854 * auVar278._12_4_ + fStack_914 * auVar245._12_4_;
          auVar107._16_4_ =
               fStack_af0 * auVar218._16_4_ +
               fStack_850 * auVar278._16_4_ + fStack_910 * auVar245._16_4_;
          auVar107._20_4_ =
               fStack_aec * auVar218._20_4_ +
               fStack_84c * auVar278._20_4_ + fStack_90c * auVar245._20_4_;
          auVar107._24_4_ =
               fStack_ae8 * auVar218._24_4_ +
               fStack_848 * auVar278._24_4_ + fStack_908 * auVar245._24_4_;
          auVar107._28_4_ = fVar227 + local_900._28_4_ + auVar94._28_4_;
          auVar225._8_4_ = 0x7fffffff;
          auVar225._0_8_ = 0x7fffffff7fffffff;
          auVar225._12_4_ = 0x7fffffff;
          auVar225._16_4_ = 0x7fffffff;
          auVar225._20_4_ = 0x7fffffff;
          auVar225._24_4_ = 0x7fffffff;
          auVar225._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar107,auVar225);
          auVar255._8_4_ = 0x3e99999a;
          auVar255._0_8_ = 0x3e99999a3e99999a;
          auVar255._12_4_ = 0x3e99999a;
          auVar255._16_4_ = 0x3e99999a;
          auVar255._20_4_ = 0x3e99999a;
          auVar255._24_4_ = 0x3e99999a;
          auVar255._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar255,1);
          local_800 = vorps_avx(auVar94,auVar145);
          auVar108._0_4_ =
               auVar394._0_4_ * (float)local_b00._0_4_ +
               (float)local_860._0_4_ * (float)local_d20._0_4_ +
               (float)local_920._0_4_ * (float)local_ba0._0_4_;
          auVar108._4_4_ =
               auVar394._4_4_ * (float)local_b00._4_4_ +
               (float)local_860._4_4_ * (float)local_d20._4_4_ +
               (float)local_920._4_4_ * (float)local_ba0._4_4_;
          auVar108._8_4_ =
               auVar394._8_4_ * fStack_af8 + fStack_858 * fStack_d18 + fStack_918 * fStack_b98;
          auVar108._12_4_ =
               auVar394._12_4_ * fStack_af4 + fStack_854 * fStack_d14 + fStack_914 * fStack_b94;
          auVar108._16_4_ =
               auVar394._16_4_ * fStack_af0 + fStack_850 * fStack_d10 + fStack_910 * fStack_b90;
          auVar108._20_4_ =
               auVar394._20_4_ * fStack_aec + fStack_84c * fStack_d0c + fStack_90c * fStack_b8c;
          auVar108._24_4_ =
               auVar394._24_4_ * fStack_ae8 + fStack_848 * fStack_d08 + fStack_908 * fStack_b88;
          auVar108._28_4_ = local_800._28_4_ + local_7c0._28_4_ + fVar227;
          auVar94 = vandps_avx(auVar108,auVar225);
          auVar94 = vcmpps_avx(auVar94,auVar255,1);
          auVar94 = vorps_avx(auVar94,auVar145);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar170,auVar146,auVar94);
          local_820 = ZEXT432(local_d64);
          local_840 = vpshufd_avx(ZEXT416(local_d64),0);
          auVar190 = vpcmpgtd_avx(auVar94._16_16_,local_840);
          auVar275 = vpcmpgtd_avx(auVar94._0_16_,local_840);
          auVar147._16_16_ = auVar190;
          auVar147._0_16_ = auVar275;
          local_7e0 = vblendps_avx(ZEXT1632(auVar275),auVar147,0xf0);
          auVar94 = vandnps_avx(local_7e0,local_7c0);
          local_8e0._4_4_ = local_880._4_4_ + (float)local_940._4_4_;
          local_8e0._0_4_ = local_880._0_4_ + (float)local_940._0_4_;
          fStack_8d8 = local_880._8_4_ + fStack_938;
          fStack_8d4 = local_880._12_4_ + fStack_934;
          fStack_8d0 = local_880._16_4_ + fStack_930;
          fStack_8cc = local_880._20_4_ + fStack_92c;
          fStack_8c8 = local_880._24_4_ + fStack_928;
          fStack_8c4 = local_880._28_4_ + fStack_924;
          while( true ) {
            local_500 = auVar94;
            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar94 >> 0x7f,0) == '\0') &&
                  (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0xbf,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar94[0x1f]) break;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar148,local_880,auVar94);
            auVar10 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar10 = vminps_avx(auVar106,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar106 = vcmpps_avx(auVar106,auVar10,0);
            auVar10 = auVar94 & auVar106;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar106,auVar94);
            }
            uVar76 = vmovmskps_avx(auVar94);
            uVar82 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
              }
            }
            uVar78 = (ulong)uVar82;
            *(undefined4 *)(local_500 + uVar78 * 4) = 0;
            fVar227 = local_1a0[uVar78];
            uVar82 = *(uint *)(local_4e0 + uVar78 * 4);
            fVar228 = auVar128._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              fVar228 = sqrtf((float)local_a80._0_4_);
            }
            auVar275 = vminps_avx(_local_be0,_local_c00);
            auVar190 = vmaxps_avx(_local_be0,_local_c00);
            auVar2 = vminps_avx(_local_bf0,_local_c10);
            auVar88 = vminps_avx(auVar275,auVar2);
            auVar275 = vmaxps_avx(_local_bf0,_local_c10);
            auVar2 = vmaxps_avx(auVar190,auVar275);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar190 = vandps_avx(auVar88,auVar185);
            auVar275 = vandps_avx(auVar2,auVar185);
            auVar190 = vmaxps_avx(auVar190,auVar275);
            auVar275 = vmovshdup_avx(auVar190);
            auVar275 = vmaxss_avx(auVar275,auVar190);
            auVar190 = vshufpd_avx(auVar190,auVar190,1);
            auVar190 = vmaxss_avx(auVar190,auVar275);
            local_ae0._0_4_ = auVar190._0_4_ * 1.9073486e-06;
            local_b40._0_4_ = fVar228 * 1.9073486e-06;
            local_a60._0_16_ = vshufps_avx(auVar2,auVar2,0xff);
            auVar190 = vinsertps_avx(ZEXT416(uVar82),ZEXT416((uint)fVar227),0x10);
            auVar285 = ZEXT1664(auVar190);
            lVar77 = 5;
            do {
              do {
                bVar83 = lVar77 == 0;
                lVar77 = lVar77 + -1;
                if (bVar83) goto LAB_0097f887;
                auVar275 = auVar285._0_16_;
                auVar190 = vmovshdup_avx(auVar275);
                fVar237 = auVar190._0_4_;
                fVar233 = 1.0 - fVar237;
                auVar190 = vshufps_avx(auVar275,auVar275,0x55);
                fVar227 = auVar190._0_4_;
                fVar228 = auVar190._4_4_;
                fVar229 = auVar190._8_4_;
                fVar231 = auVar190._12_4_;
                auVar190 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                fVar235 = auVar190._0_4_;
                fVar270 = auVar190._4_4_;
                fVar286 = auVar190._8_4_;
                fVar290 = auVar190._12_4_;
                fVar294 = (float)local_bf0._0_4_ * fVar227 + (float)local_c00._0_4_ * fVar235;
                fVar298 = (float)local_bf0._4_4_ * fVar228 + (float)local_c00._4_4_ * fVar270;
                fVar302 = fStack_be8 * fVar229 + fStack_bf8 * fVar286;
                fVar306 = fStack_be4 * fVar231 + fStack_bf4 * fVar290;
                auVar240._0_4_ =
                     fVar235 * ((float)local_c00._0_4_ * fVar227 + fVar235 * (float)local_be0._0_4_)
                     + fVar227 * fVar294;
                auVar240._4_4_ =
                     fVar270 * ((float)local_c00._4_4_ * fVar228 + fVar270 * (float)local_be0._4_4_)
                     + fVar228 * fVar298;
                auVar240._8_4_ =
                     fVar286 * (fStack_bf8 * fVar229 + fVar286 * fStack_bd8) + fVar229 * fVar302;
                auVar240._12_4_ =
                     fVar290 * (fStack_bf4 * fVar231 + fVar290 * fStack_bd4) + fVar231 * fVar306;
                auVar186._0_4_ =
                     fVar235 * fVar294 +
                     fVar227 * (fVar227 * (float)local_c10._0_4_ + (float)local_bf0._0_4_ * fVar235)
                ;
                auVar186._4_4_ =
                     fVar270 * fVar298 +
                     fVar228 * (fVar228 * (float)local_c10._4_4_ + (float)local_bf0._4_4_ * fVar270)
                ;
                auVar186._8_4_ =
                     fVar286 * fVar302 + fVar229 * (fVar229 * fStack_c08 + fStack_be8 * fVar286);
                auVar186._12_4_ =
                     fVar290 * fVar306 + fVar231 * (fVar231 * fStack_c04 + fStack_be4 * fVar290);
                auVar190 = vshufps_avx(auVar275,auVar275,0);
                auVar130._0_4_ = auVar190._0_4_ * (float)local_a70._0_4_ + 0.0;
                auVar130._4_4_ = auVar190._4_4_ * (float)local_a70._4_4_ + 0.0;
                auVar130._8_4_ = auVar190._8_4_ * fStack_a68 + 0.0;
                auVar130._12_4_ = auVar190._12_4_ * fStack_a64 + 0.0;
                auVar87._0_4_ = fVar235 * auVar240._0_4_ + fVar227 * auVar186._0_4_;
                auVar87._4_4_ = fVar270 * auVar240._4_4_ + fVar228 * auVar186._4_4_;
                auVar87._8_4_ = fVar286 * auVar240._8_4_ + fVar229 * auVar186._8_4_;
                auVar87._12_4_ = fVar290 * auVar240._12_4_ + fVar231 * auVar186._12_4_;
                local_a00._0_16_ = auVar87;
                auVar190 = vsubps_avx(auVar130,auVar87);
                _local_ba0 = auVar190;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar227 = auVar190._0_4_;
                if (fVar227 < 0.0) {
                  local_b60._0_16_ = auVar186;
                  fVar228 = sqrtf(fVar227);
                  auVar285 = ZEXT1664(auVar275);
                  auVar186 = local_b60._0_16_;
                }
                else {
                  auVar2 = vsqrtss_avx(auVar190,auVar190);
                  fVar228 = auVar2._0_4_;
                }
                auVar2 = vsubps_avx(auVar186,auVar240);
                auVar311._0_4_ = auVar2._0_4_ * 3.0;
                auVar311._4_4_ = auVar2._4_4_ * 3.0;
                auVar311._8_4_ = auVar2._8_4_ * 3.0;
                auVar311._12_4_ = auVar2._12_4_ * 3.0;
                auVar2 = vshufps_avx(ZEXT416((uint)(fVar237 * 6.0)),ZEXT416((uint)(fVar237 * 6.0)),0
                                    );
                auVar88 = ZEXT416((uint)((fVar233 - (fVar237 + fVar237)) * 6.0));
                auVar158 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)((fVar237 - (fVar233 + fVar233)) * 6.0));
                auVar187 = vshufps_avx(auVar88,auVar88,0);
                auVar3 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0)),0
                                    );
                auVar88 = vdpps_avx(auVar311,auVar311,0x7f);
                auVar131._0_4_ =
                     auVar3._0_4_ * (float)local_be0._0_4_ +
                     auVar187._0_4_ * (float)local_c00._0_4_ +
                     auVar2._0_4_ * (float)local_c10._0_4_ + auVar158._0_4_ * (float)local_bf0._0_4_
                ;
                auVar131._4_4_ =
                     auVar3._4_4_ * (float)local_be0._4_4_ +
                     auVar187._4_4_ * (float)local_c00._4_4_ +
                     auVar2._4_4_ * (float)local_c10._4_4_ + auVar158._4_4_ * (float)local_bf0._4_4_
                ;
                auVar131._8_4_ =
                     auVar3._8_4_ * fStack_bd8 +
                     auVar187._8_4_ * fStack_bf8 +
                     auVar2._8_4_ * fStack_c08 + auVar158._8_4_ * fStack_be8;
                auVar131._12_4_ =
                     auVar3._12_4_ * fStack_bd4 +
                     auVar187._12_4_ * fStack_bf4 +
                     auVar2._12_4_ * fStack_c04 + auVar158._12_4_ * fStack_be4;
                auVar2 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
                auVar158 = vrsqrtss_avx(auVar2,auVar2);
                fVar231 = auVar158._0_4_;
                fVar229 = auVar88._0_4_;
                auVar158 = vdpps_avx(auVar311,auVar131,0x7f);
                auVar187 = vshufps_avx(auVar88,auVar88,0);
                auVar132._0_4_ = auVar131._0_4_ * auVar187._0_4_;
                auVar132._4_4_ = auVar131._4_4_ * auVar187._4_4_;
                auVar132._8_4_ = auVar131._8_4_ * auVar187._8_4_;
                auVar132._12_4_ = auVar131._12_4_ * auVar187._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar210._0_4_ = auVar311._0_4_ * auVar158._0_4_;
                auVar210._4_4_ = auVar311._4_4_ * auVar158._4_4_;
                auVar210._8_4_ = auVar311._8_4_ * auVar158._8_4_;
                auVar210._12_4_ = auVar311._12_4_ * auVar158._12_4_;
                auVar3 = vsubps_avx(auVar132,auVar210);
                auVar158 = vrcpss_avx(auVar2,auVar2);
                auVar2 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                    ZEXT416((uint)(auVar285._0_4_ * (float)local_b40._0_4_)));
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar229 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar78 = CONCAT44(auVar311._4_4_,auVar311._0_4_);
                auVar241._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar241._8_4_ = -auVar311._8_4_;
                auVar241._12_4_ = -auVar311._12_4_;
                auVar187 = ZEXT416((uint)(fVar231 * 1.5 +
                                         fVar229 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar188._0_4_ = auVar187._0_4_ * auVar3._0_4_ * auVar158._0_4_;
                auVar188._4_4_ = auVar187._4_4_ * auVar3._4_4_ * auVar158._4_4_;
                auVar188._8_4_ = auVar187._8_4_ * auVar3._8_4_ * auVar158._8_4_;
                auVar188._12_4_ = auVar187._12_4_ * auVar3._12_4_ * auVar158._12_4_;
                auVar276._0_4_ = auVar311._0_4_ * auVar187._0_4_;
                auVar276._4_4_ = auVar311._4_4_ * auVar187._4_4_;
                auVar276._8_4_ = auVar311._8_4_ * auVar187._8_4_;
                auVar276._12_4_ = auVar311._12_4_ * auVar187._12_4_;
                if (fVar229 < 0.0) {
                  local_b60._0_16_ = auVar241;
                  local_9a0._0_16_ = auVar276;
                  local_ac0._0_16_ = auVar188;
                  fVar229 = sqrtf(fVar229);
                  auVar188 = local_ac0._0_16_;
                  auVar241 = local_b60._0_16_;
                  auVar276 = local_9a0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar229 = auVar88._0_4_;
                }
                auVar88 = vdpps_avx(_local_ba0,auVar276,0x7f);
                fVar228 = ((float)local_ae0._0_4_ / fVar229) * (fVar228 + 1.0) +
                          auVar2._0_4_ + fVar228 * (float)local_ae0._0_4_;
                auVar158 = vdpps_avx(auVar241,auVar276,0x7f);
                auVar187 = vdpps_avx(_local_ba0,auVar188,0x7f);
                auVar3 = vdpps_avx(_local_a70,auVar276,0x7f);
                auVar4 = vdpps_avx(_local_ba0,auVar241,0x7f);
                fVar229 = auVar158._0_4_ + auVar187._0_4_;
                fVar231 = auVar88._0_4_;
                auVar89._0_4_ = fVar231 * fVar231;
                auVar89._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar89._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar89._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar187 = vsubps_avx(auVar190,auVar89);
                auVar158 = vdpps_avx(_local_ba0,_local_a70,0x7f);
                fVar233 = auVar4._0_4_ - fVar231 * fVar229;
                fVar235 = auVar158._0_4_ - fVar231 * auVar3._0_4_;
                auVar158 = vrsqrtss_avx(auVar187,auVar187);
                fVar270 = auVar187._0_4_;
                fVar231 = auVar158._0_4_;
                fVar231 = fVar231 * 1.5 + fVar270 * -0.5 * fVar231 * fVar231 * fVar231;
                if (fVar270 < 0.0) {
                  local_b60._0_4_ = fVar228;
                  local_9a0._0_16_ = auVar3;
                  local_ac0._0_16_ = ZEXT416((uint)fVar229);
                  local_8a0._0_4_ = fVar233;
                  local_9c0._0_4_ = fVar235;
                  local_a40._0_4_ = fVar231;
                  fVar270 = sqrtf(fVar270);
                  fVar231 = (float)local_a40._0_4_;
                  fVar233 = (float)local_8a0._0_4_;
                  fVar235 = (float)local_9c0._0_4_;
                  auVar3 = local_9a0._0_16_;
                  fVar228 = (float)local_b60._0_4_;
                  auVar158 = local_ac0._0_16_;
                }
                else {
                  auVar158 = vsqrtss_avx(auVar187,auVar187);
                  fVar270 = auVar158._0_4_;
                  auVar158 = ZEXT416((uint)fVar229);
                }
                auVar4 = vpermilps_avx(local_a00._0_16_,0xff);
                auVar93 = vshufps_avx(auVar311,auVar311,0xff);
                fVar229 = fVar233 * fVar231 - auVar93._0_4_;
                auVar211._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar242._0_4_ = -fVar229;
                auVar242._4_4_ = 0x80000000;
                auVar242._8_4_ = 0x80000000;
                auVar242._12_4_ = 0x80000000;
                auVar187 = vinsertps_avx(auVar242,ZEXT416((uint)(fVar235 * fVar231)),0x1c);
                auVar3 = vmovsldup_avx(ZEXT416((uint)(auVar158._0_4_ * fVar235 * fVar231 -
                                                     auVar3._0_4_ * fVar229)));
                auVar187 = vdivps_avx(auVar187,auVar3);
                auVar158 = vinsertps_avx(auVar158,auVar211,0x10);
                auVar158 = vdivps_avx(auVar158,auVar3);
                auVar3 = vmovsldup_avx(auVar88);
                auVar90 = ZEXT416((uint)(fVar270 - auVar4._0_4_));
                auVar4 = vmovsldup_avx(auVar90);
                auVar159._0_4_ = auVar3._0_4_ * auVar187._0_4_ + auVar4._0_4_ * auVar158._0_4_;
                auVar159._4_4_ = auVar3._4_4_ * auVar187._4_4_ + auVar4._4_4_ * auVar158._4_4_;
                auVar159._8_4_ = auVar3._8_4_ * auVar187._8_4_ + auVar4._8_4_ * auVar158._8_4_;
                auVar159._12_4_ = auVar3._12_4_ * auVar187._12_4_ + auVar4._12_4_ * auVar158._12_4_;
                auVar158 = vsubps_avx(auVar275,auVar159);
                auVar285 = ZEXT1664(auVar158);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar275 = vandps_avx(auVar88,auVar160);
              } while (fVar228 <= auVar275._0_4_);
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar275 = vandps_avx(auVar90,auVar189);
            } while ((float)local_a60._0_4_ * 1.9073486e-06 + auVar2._0_4_ + fVar228 <=
                     auVar275._0_4_);
            fVar228 = auVar158._0_4_ + (float)local_980._0_4_;
            if ((fVar207 <= fVar228) &&
               (fVar229 = *(float *)(ray + k * 4 + 0x100), fVar228 <= fVar229)) {
              auVar275 = vmovshdup_avx(auVar158);
              fVar231 = auVar275._0_4_;
              if ((0.0 <= fVar231) && (fVar231 <= 1.0)) {
                auVar190 = vrsqrtss_avx(auVar190,auVar190);
                fVar233 = auVar190._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar75].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar190 = ZEXT416((uint)(fVar233 * 1.5 +
                                           fVar227 * -0.5 * fVar233 * fVar233 * fVar233));
                  auVar190 = vshufps_avx(auVar190,auVar190,0);
                  auVar191._0_4_ = auVar190._0_4_ * (float)local_ba0._0_4_;
                  auVar191._4_4_ = auVar190._4_4_ * (float)local_ba0._4_4_;
                  auVar191._8_4_ = auVar190._8_4_ * fStack_b98;
                  auVar191._12_4_ = auVar190._12_4_ * fStack_b94;
                  auVar133._0_4_ = auVar311._0_4_ + auVar93._0_4_ * auVar191._0_4_;
                  auVar133._4_4_ = auVar311._4_4_ + auVar93._4_4_ * auVar191._4_4_;
                  auVar133._8_4_ = auVar311._8_4_ + auVar93._8_4_ * auVar191._8_4_;
                  auVar133._12_4_ = auVar311._12_4_ + auVar93._12_4_ * auVar191._12_4_;
                  auVar190 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar275 = vshufps_avx(auVar311,auVar311,0xc9);
                  auVar192._0_4_ = auVar275._0_4_ * auVar191._0_4_;
                  auVar192._4_4_ = auVar275._4_4_ * auVar191._4_4_;
                  auVar192._8_4_ = auVar275._8_4_ * auVar191._8_4_;
                  auVar192._12_4_ = auVar275._12_4_ * auVar191._12_4_;
                  auVar212._0_4_ = auVar311._0_4_ * auVar190._0_4_;
                  auVar212._4_4_ = auVar311._4_4_ * auVar190._4_4_;
                  auVar212._8_4_ = auVar311._8_4_ * auVar190._8_4_;
                  auVar212._12_4_ = auVar311._12_4_ * auVar190._12_4_;
                  auVar2 = vsubps_avx(auVar212,auVar192);
                  auVar190 = vshufps_avx(auVar2,auVar2,0xc9);
                  auVar275 = vshufps_avx(auVar133,auVar133,0xc9);
                  auVar213._0_4_ = auVar275._0_4_ * auVar190._0_4_;
                  auVar213._4_4_ = auVar275._4_4_ * auVar190._4_4_;
                  auVar213._8_4_ = auVar275._8_4_ * auVar190._8_4_;
                  auVar213._12_4_ = auVar275._12_4_ * auVar190._12_4_;
                  auVar190 = vshufps_avx(auVar2,auVar2,0xd2);
                  auVar134._0_4_ = auVar133._0_4_ * auVar190._0_4_;
                  auVar134._4_4_ = auVar133._4_4_ * auVar190._4_4_;
                  auVar134._8_4_ = auVar133._8_4_ * auVar190._8_4_;
                  auVar134._12_4_ = auVar133._12_4_ * auVar190._12_4_;
                  auVar190 = vsubps_avx(auVar213,auVar134);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    uVar1 = vextractps_avx(auVar190,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar190,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar190._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar231;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = local_960;
                    *(uint *)(ray + k * 4 + 0x240) = uVar75;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar7 = context->user;
                    auStack_710 = vshufps_avx(auVar158,auVar158,0x55);
                    auStack_770 = vshufps_avx(auVar190,auVar190,0x55);
                    auStack_750 = vshufps_avx(auVar190,auVar190,0xaa);
                    auStack_730 = vshufps_avx(auVar190,auVar190,0);
                    local_780 = (RTCHitN  [16])auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = auStack_710;
                    local_700 = ZEXT832(0) << 0x20;
                    local_6e0 = local_620._0_8_;
                    uStack_6d8 = local_620._8_8_;
                    uStack_6d0 = local_620._16_8_;
                    uStack_6c8 = local_620._24_8_;
                    local_6c0 = local_600;
                    auVar94 = vcmpps_avx(local_600,local_600,0xf);
                    local_b08[1] = auVar94;
                    *local_b08 = auVar94;
                    local_6a0 = pRVar7->instID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    local_680 = pRVar7->instPrimID[0];
                    uStack_67c = local_680;
                    uStack_678 = local_680;
                    uStack_674 = local_680;
                    uStack_670 = local_680;
                    uStack_66c = local_680;
                    uStack_668 = local_680;
                    uStack_664 = local_680;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    local_c40 = *local_b10;
                    local_c30 = *local_b18;
                    local_bd0.valid = (int *)local_c40;
                    local_bd0.geometryUserPtr = pGVar6->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = local_780;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_bd0);
                    }
                    auVar190 = vpcmpeqd_avx(local_c40,ZEXT816(0) << 0x40);
                    auVar275 = vpcmpeqd_avx(local_c30,ZEXT816(0) << 0x40);
                    auVar171._16_16_ = auVar275;
                    auVar171._0_16_ = auVar190;
                    auVar94 = _DAT_01f7b020 & ~auVar171;
                    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar94 >> 0x7f,0) != '\0') ||
                          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar94 >> 0xbf,0) != '\0') ||
                        (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar94[0x1f] < '\0') {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_bd0);
                      }
                      auVar190 = vpcmpeqd_avx(local_c40,ZEXT816(0) << 0x40);
                      auVar275 = vpcmpeqd_avx(local_c30,ZEXT816(0) << 0x40);
                      auVar109._16_16_ = auVar275;
                      auVar109._0_16_ = auVar190;
                      auVar94 = _DAT_01f7b020 & ~auVar109;
                      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar94 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar94 >> 0x7f,0) != '\0') ||
                            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar94 >> 0xbf,0) != '\0') ||
                          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar94[0x1f] < '\0') {
                        auVar110._0_8_ = auVar190._0_8_ ^ 0xffffffffffffffff;
                        auVar110._8_4_ = auVar190._8_4_ ^ 0xffffffff;
                        auVar110._12_4_ = auVar190._12_4_ ^ 0xffffffff;
                        auVar110._16_4_ = auVar275._0_4_ ^ 0xffffffff;
                        auVar110._20_4_ = auVar275._4_4_ ^ 0xffffffff;
                        auVar110._24_4_ = auVar275._8_4_ ^ 0xffffffff;
                        auVar110._28_4_ = auVar275._12_4_ ^ 0xffffffff;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar94;
                        goto LAB_0097f887;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar229;
                  }
                }
              }
            }
LAB_0097f887:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar326._4_4_ = uVar1;
            auVar326._0_4_ = uVar1;
            auVar326._8_4_ = uVar1;
            auVar326._12_4_ = uVar1;
            auVar326._16_4_ = uVar1;
            auVar326._20_4_ = uVar1;
            auVar326._24_4_ = uVar1;
            auVar326._28_4_ = uVar1;
            auVar393 = ZEXT3264(auVar326);
            auVar94 = vcmpps_avx(_local_8e0,auVar326,2);
            auVar94 = vandps_avx(auVar94,local_500);
          }
          auVar111._0_4_ = (float)local_940._0_4_ + (float)local_8c0._0_4_;
          auVar111._4_4_ = (float)local_940._4_4_ + (float)local_8c0._4_4_;
          auVar111._8_4_ = fStack_938 + fStack_8b8;
          auVar111._12_4_ = fStack_934 + fStack_8b4;
          auVar111._16_4_ = fStack_930 + fStack_8b0;
          auVar111._20_4_ = fStack_92c + fStack_8ac;
          auVar111._24_4_ = fStack_928 + fStack_8a8;
          auVar111._28_4_ = fStack_924 + fStack_8a4;
          auVar190 = vshufps_avx(auVar393._0_16_,auVar393._0_16_,0);
          auVar149._16_16_ = auVar190;
          auVar149._0_16_ = auVar190;
          auVar94 = vcmpps_avx(auVar111,auVar149,2);
          _local_8e0 = vandps_avx(auVar94,local_900);
          auVar112._8_4_ = 3;
          auVar112._0_8_ = 0x300000003;
          auVar112._12_4_ = 3;
          auVar112._16_4_ = 3;
          auVar112._20_4_ = 3;
          auVar112._24_4_ = 3;
          auVar112._28_4_ = 3;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar150,auVar112,local_800);
          auVar190 = vpcmpgtd_avx(auVar94._16_16_,local_840);
          auVar275 = vpshufd_avx(local_820._0_16_,0);
          auVar275 = vpcmpgtd_avx(auVar94._0_16_,auVar275);
          auVar151._16_16_ = auVar190;
          auVar151._0_16_ = auVar275;
          local_900 = vblendps_avx(ZEXT1632(auVar275),auVar151,0xf0);
          auVar94 = vandnps_avx(local_900,_local_8e0);
          local_880 = _local_4a0;
          local_8c0._4_4_ = (float)local_940._4_4_ + (float)local_4a0._4_4_;
          local_8c0._0_4_ = (float)local_940._0_4_ + (float)local_4a0._0_4_;
          fStack_8b8 = fStack_938 + fStack_498;
          fStack_8b4 = fStack_934 + fStack_494;
          fStack_8b0 = fStack_930 + fStack_490;
          fStack_8ac = fStack_92c + fStack_48c;
          fStack_8a8 = fStack_928 + fStack_488;
          fStack_8a4 = fStack_924 + fStack_484;
          auVar339 = ZEXT3264(local_aa0);
          auVar353 = ZEXT3264(local_b80);
          auVar285 = ZEXT3264(local_a20);
          while( true ) {
            local_520 = auVar94;
            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar94 >> 0x7f,0) == '\0') &&
                  (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0xbf,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar94[0x1f]) break;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar152,local_880,auVar94);
            auVar10 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar10 = vminps_avx(auVar106,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar106 = vcmpps_avx(auVar106,auVar10,0);
            auVar10 = auVar94 & auVar106;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar106,auVar94);
            }
            uVar76 = vmovmskps_avx(auVar94);
            uVar82 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
              }
            }
            uVar78 = (ulong)uVar82;
            *(undefined4 *)(local_520 + uVar78 * 4) = 0;
            fVar227 = local_1c0[uVar78];
            uVar82 = *(uint *)(local_480 + uVar78 * 4);
            fVar228 = auVar19._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              fVar228 = sqrtf((float)local_a80._0_4_);
              auVar285 = ZEXT3264(local_a20);
              auVar353 = ZEXT3264(local_b80);
              auVar339 = ZEXT3264(local_aa0);
            }
            auVar275 = vminps_avx(_local_be0,_local_c00);
            auVar190 = vmaxps_avx(_local_be0,_local_c00);
            auVar2 = vminps_avx(_local_bf0,_local_c10);
            auVar88 = vminps_avx(auVar275,auVar2);
            auVar275 = vmaxps_avx(_local_bf0,_local_c10);
            auVar2 = vmaxps_avx(auVar190,auVar275);
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar190 = vandps_avx(auVar88,auVar193);
            auVar275 = vandps_avx(auVar2,auVar193);
            auVar190 = vmaxps_avx(auVar190,auVar275);
            auVar275 = vmovshdup_avx(auVar190);
            auVar275 = vmaxss_avx(auVar275,auVar190);
            auVar190 = vshufpd_avx(auVar190,auVar190,1);
            auVar190 = vmaxss_avx(auVar190,auVar275);
            local_ae0._0_4_ = auVar190._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar228 * 1.9073486e-06;
            local_a60._0_16_ = vshufps_avx(auVar2,auVar2,0xff);
            auVar190 = vinsertps_avx(ZEXT416(uVar82),ZEXT416((uint)fVar227),0x10);
            auVar393 = ZEXT1664(auVar190);
            lVar77 = 5;
            do {
              do {
                bVar83 = lVar77 == 0;
                lVar77 = lVar77 + -1;
                if (bVar83) goto LAB_0098045b;
                auVar275 = auVar393._0_16_;
                auVar190 = vmovshdup_avx(auVar275);
                fVar237 = auVar190._0_4_;
                fVar233 = 1.0 - fVar237;
                auVar190 = vshufps_avx(auVar275,auVar275,0x55);
                fVar227 = auVar190._0_4_;
                fVar228 = auVar190._4_4_;
                fVar229 = auVar190._8_4_;
                fVar231 = auVar190._12_4_;
                auVar190 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                fVar235 = auVar190._0_4_;
                fVar270 = auVar190._4_4_;
                fVar286 = auVar190._8_4_;
                fVar290 = auVar190._12_4_;
                fVar294 = (float)local_bf0._0_4_ * fVar227 + (float)local_c00._0_4_ * fVar235;
                fVar298 = (float)local_bf0._4_4_ * fVar228 + (float)local_c00._4_4_ * fVar270;
                fVar302 = fStack_be8 * fVar229 + fStack_bf8 * fVar286;
                fVar306 = fStack_be4 * fVar231 + fStack_bf4 * fVar290;
                auVar243._0_4_ =
                     fVar235 * ((float)local_c00._0_4_ * fVar227 + fVar235 * (float)local_be0._0_4_)
                     + fVar227 * fVar294;
                auVar243._4_4_ =
                     fVar270 * ((float)local_c00._4_4_ * fVar228 + fVar270 * (float)local_be0._4_4_)
                     + fVar228 * fVar298;
                auVar243._8_4_ =
                     fVar286 * (fStack_bf8 * fVar229 + fVar286 * fStack_bd8) + fVar229 * fVar302;
                auVar243._12_4_ =
                     fVar290 * (fStack_bf4 * fVar231 + fVar290 * fStack_bd4) + fVar231 * fVar306;
                auVar194._0_4_ =
                     fVar235 * fVar294 +
                     fVar227 * (fVar227 * (float)local_c10._0_4_ + (float)local_bf0._0_4_ * fVar235)
                ;
                auVar194._4_4_ =
                     fVar270 * fVar298 +
                     fVar228 * (fVar228 * (float)local_c10._4_4_ + (float)local_bf0._4_4_ * fVar270)
                ;
                auVar194._8_4_ =
                     fVar286 * fVar302 + fVar229 * (fVar229 * fStack_c08 + fStack_be8 * fVar286);
                auVar194._12_4_ =
                     fVar290 * fVar306 + fVar231 * (fVar231 * fStack_c04 + fStack_be4 * fVar290);
                auVar190 = vshufps_avx(auVar275,auVar275,0);
                auVar135._0_4_ = auVar190._0_4_ * (float)local_a70._0_4_ + 0.0;
                auVar135._4_4_ = auVar190._4_4_ * (float)local_a70._4_4_ + 0.0;
                auVar135._8_4_ = auVar190._8_4_ * fStack_a68 + 0.0;
                auVar135._12_4_ = auVar190._12_4_ * fStack_a64 + 0.0;
                auVar91._0_4_ = fVar235 * auVar243._0_4_ + fVar227 * auVar194._0_4_;
                auVar91._4_4_ = fVar270 * auVar243._4_4_ + fVar228 * auVar194._4_4_;
                auVar91._8_4_ = fVar286 * auVar243._8_4_ + fVar229 * auVar194._8_4_;
                auVar91._12_4_ = fVar290 * auVar243._12_4_ + fVar231 * auVar194._12_4_;
                local_a00._0_16_ = auVar91;
                auVar190 = vsubps_avx(auVar135,auVar91);
                _local_ba0 = auVar190;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar227 = auVar190._0_4_;
                if (fVar227 < 0.0) {
                  local_b40._0_16_ = auVar243;
                  fVar228 = sqrtf(fVar227);
                  auVar393 = ZEXT1664(auVar275);
                  auVar243 = local_b40._0_16_;
                }
                else {
                  auVar2 = vsqrtss_avx(auVar190,auVar190);
                  fVar228 = auVar2._0_4_;
                }
                auVar2 = vsubps_avx(auVar194,auVar243);
                auVar277._0_4_ = auVar2._0_4_ * 3.0;
                auVar277._4_4_ = auVar2._4_4_ * 3.0;
                auVar277._8_4_ = auVar2._8_4_ * 3.0;
                auVar277._12_4_ = auVar2._12_4_ * 3.0;
                auVar2 = vshufps_avx(ZEXT416((uint)(fVar237 * 6.0)),ZEXT416((uint)(fVar237 * 6.0)),0
                                    );
                auVar88 = ZEXT416((uint)((fVar233 - (fVar237 + fVar237)) * 6.0));
                auVar158 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)((fVar237 - (fVar233 + fVar233)) * 6.0));
                auVar187 = vshufps_avx(auVar88,auVar88,0);
                auVar3 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0)),0
                                    );
                auVar88 = vdpps_avx(auVar277,auVar277,0x7f);
                auVar136._0_4_ =
                     auVar3._0_4_ * (float)local_be0._0_4_ +
                     auVar187._0_4_ * (float)local_c00._0_4_ +
                     auVar2._0_4_ * (float)local_c10._0_4_ + auVar158._0_4_ * (float)local_bf0._0_4_
                ;
                auVar136._4_4_ =
                     auVar3._4_4_ * (float)local_be0._4_4_ +
                     auVar187._4_4_ * (float)local_c00._4_4_ +
                     auVar2._4_4_ * (float)local_c10._4_4_ + auVar158._4_4_ * (float)local_bf0._4_4_
                ;
                auVar136._8_4_ =
                     auVar3._8_4_ * fStack_bd8 +
                     auVar187._8_4_ * fStack_bf8 +
                     auVar2._8_4_ * fStack_c08 + auVar158._8_4_ * fStack_be8;
                auVar136._12_4_ =
                     auVar3._12_4_ * fStack_bd4 +
                     auVar187._12_4_ * fStack_bf4 +
                     auVar2._12_4_ * fStack_c04 + auVar158._12_4_ * fStack_be4;
                auVar2 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
                auVar158 = vrsqrtss_avx(auVar2,auVar2);
                fVar231 = auVar158._0_4_;
                fVar229 = auVar88._0_4_;
                auVar158 = vdpps_avx(auVar277,auVar136,0x7f);
                auVar187 = vshufps_avx(auVar88,auVar88,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar187._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar187._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar187._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar187._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar214._0_4_ = auVar277._0_4_ * auVar158._0_4_;
                auVar214._4_4_ = auVar277._4_4_ * auVar158._4_4_;
                auVar214._8_4_ = auVar277._8_4_ * auVar158._8_4_;
                auVar214._12_4_ = auVar277._12_4_ * auVar158._12_4_;
                auVar3 = vsubps_avx(auVar137,auVar214);
                auVar158 = vrcpss_avx(auVar2,auVar2);
                auVar2 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                    ZEXT416((uint)(auVar393._0_4_ * (float)local_9a0._0_4_)));
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar229 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar78 = CONCAT44(auVar277._4_4_,auVar277._0_4_);
                auVar321._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar321._8_4_ = -auVar277._8_4_;
                auVar321._12_4_ = -auVar277._12_4_;
                auVar187 = ZEXT416((uint)(fVar231 * 1.5 +
                                         fVar229 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar195._0_4_ = auVar187._0_4_ * auVar3._0_4_ * auVar158._0_4_;
                auVar195._4_4_ = auVar187._4_4_ * auVar3._4_4_ * auVar158._4_4_;
                auVar195._8_4_ = auVar187._8_4_ * auVar3._8_4_ * auVar158._8_4_;
                auVar195._12_4_ = auVar187._12_4_ * auVar3._12_4_ * auVar158._12_4_;
                local_b60._0_4_ = auVar277._0_4_ * auVar187._0_4_;
                local_b60._4_4_ = auVar277._4_4_ * auVar187._4_4_;
                local_b60._8_4_ = auVar277._8_4_ * auVar187._8_4_;
                local_b60._12_4_ = auVar277._12_4_ * auVar187._12_4_;
                if (fVar229 < 0.0) {
                  local_b40._0_4_ = fVar228;
                  local_ac0._0_16_ = auVar195;
                  fVar229 = sqrtf(fVar229);
                  auVar195 = local_ac0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar229 = auVar88._0_4_;
                  local_b40._0_4_ = fVar228;
                }
                auVar88 = vdpps_avx(_local_ba0,local_b60._0_16_,0x7f);
                fVar228 = ((float)local_ae0._0_4_ / fVar229) * ((float)local_b40._0_4_ + 1.0) +
                          auVar2._0_4_ + (float)local_b40._0_4_ * (float)local_ae0._0_4_;
                auVar158 = vdpps_avx(auVar321,local_b60._0_16_,0x7f);
                auVar187 = vdpps_avx(_local_ba0,auVar195,0x7f);
                auVar3 = vdpps_avx(_local_a70,local_b60._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_ba0,auVar321,0x7f);
                fVar229 = auVar158._0_4_ + auVar187._0_4_;
                fVar231 = auVar88._0_4_;
                auVar92._0_4_ = fVar231 * fVar231;
                auVar92._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar92._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar92._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar187 = vsubps_avx(auVar190,auVar92);
                local_b60._0_16_ = ZEXT416((uint)fVar229);
                auVar158 = vdpps_avx(_local_ba0,_local_a70,0x7f);
                fVar233 = auVar4._0_4_ - fVar231 * fVar229;
                local_b40._0_16_ = auVar88;
                fVar231 = auVar158._0_4_ - fVar231 * auVar3._0_4_;
                auVar88 = vrsqrtss_avx(auVar187,auVar187);
                fVar235 = auVar187._0_4_;
                fVar229 = auVar88._0_4_;
                fVar229 = fVar229 * 1.5 + fVar235 * -0.5 * fVar229 * fVar229 * fVar229;
                if (fVar235 < 0.0) {
                  local_ac0._0_16_ = auVar3;
                  local_8a0._0_4_ = fVar233;
                  local_9c0._0_4_ = fVar231;
                  local_a40._0_4_ = fVar229;
                  fVar235 = sqrtf(fVar235);
                  fVar229 = (float)local_a40._0_4_;
                  fVar233 = (float)local_8a0._0_4_;
                  fVar231 = (float)local_9c0._0_4_;
                  auVar3 = local_ac0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar187,auVar187);
                  fVar235 = auVar88._0_4_;
                }
                auVar339 = ZEXT3264(local_aa0);
                auVar353 = ZEXT3264(local_b80);
                auVar93 = vpermilps_avx(local_a00._0_16_,0xff);
                auVar4 = vshufps_avx(auVar277,auVar277,0xff);
                fVar233 = fVar233 * fVar229 - auVar4._0_4_;
                auVar215._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar244._0_4_ = -fVar233;
                auVar244._4_4_ = 0x80000000;
                auVar244._8_4_ = 0x80000000;
                auVar244._12_4_ = 0x80000000;
                auVar88 = vinsertps_avx(auVar244,ZEXT416((uint)(fVar231 * fVar229)),0x1c);
                auVar187 = vmovsldup_avx(ZEXT416((uint)(local_b60._0_4_ * fVar231 * fVar229 -
                                                       auVar3._0_4_ * fVar233)));
                auVar88 = vdivps_avx(auVar88,auVar187);
                auVar158 = vinsertps_avx(local_b60._0_16_,auVar215,0x10);
                auVar158 = vdivps_avx(auVar158,auVar187);
                auVar187 = vmovsldup_avx(local_b40._0_16_);
                auVar93 = ZEXT416((uint)(fVar235 - auVar93._0_4_));
                auVar3 = vmovsldup_avx(auVar93);
                auVar161._0_4_ = auVar187._0_4_ * auVar88._0_4_ + auVar3._0_4_ * auVar158._0_4_;
                auVar161._4_4_ = auVar187._4_4_ * auVar88._4_4_ + auVar3._4_4_ * auVar158._4_4_;
                auVar161._8_4_ = auVar187._8_4_ * auVar88._8_4_ + auVar3._8_4_ * auVar158._8_4_;
                auVar161._12_4_ = auVar187._12_4_ * auVar88._12_4_ + auVar3._12_4_ * auVar158._12_4_
                ;
                auVar88 = vsubps_avx(auVar275,auVar161);
                auVar393 = ZEXT1664(auVar88);
                auVar162._8_4_ = 0x7fffffff;
                auVar162._0_8_ = 0x7fffffff7fffffff;
                auVar162._12_4_ = 0x7fffffff;
                auVar275 = vandps_avx(local_b40._0_16_,auVar162);
                auVar285 = ZEXT3264(local_a20);
              } while (fVar228 <= auVar275._0_4_);
              auVar196._8_4_ = 0x7fffffff;
              auVar196._0_8_ = 0x7fffffff7fffffff;
              auVar196._12_4_ = 0x7fffffff;
              auVar275 = vandps_avx(auVar93,auVar196);
            } while ((float)local_a60._0_4_ * 1.9073486e-06 + auVar2._0_4_ + fVar228 <=
                     auVar275._0_4_);
            fVar228 = auVar88._0_4_ + (float)local_980._0_4_;
            if ((fVar207 <= fVar228) &&
               (fVar229 = *(float *)(ray + k * 4 + 0x100), fVar228 <= fVar229)) {
              auVar275 = vmovshdup_avx(auVar88);
              fVar231 = auVar275._0_4_;
              if ((0.0 <= fVar231) && (fVar231 <= 1.0)) {
                auVar190 = vrsqrtss_avx(auVar190,auVar190);
                fVar233 = auVar190._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar75].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar190 = ZEXT416((uint)(fVar233 * 1.5 +
                                           fVar227 * -0.5 * fVar233 * fVar233 * fVar233));
                  auVar190 = vshufps_avx(auVar190,auVar190,0);
                  auVar197._0_4_ = auVar190._0_4_ * (float)local_ba0._0_4_;
                  auVar197._4_4_ = auVar190._4_4_ * (float)local_ba0._4_4_;
                  auVar197._8_4_ = auVar190._8_4_ * fStack_b98;
                  auVar197._12_4_ = auVar190._12_4_ * fStack_b94;
                  auVar138._0_4_ = auVar277._0_4_ + auVar4._0_4_ * auVar197._0_4_;
                  auVar138._4_4_ = auVar277._4_4_ + auVar4._4_4_ * auVar197._4_4_;
                  auVar138._8_4_ = auVar277._8_4_ + auVar4._8_4_ * auVar197._8_4_;
                  auVar138._12_4_ = auVar277._12_4_ + auVar4._12_4_ * auVar197._12_4_;
                  auVar190 = vshufps_avx(auVar197,auVar197,0xc9);
                  auVar275 = vshufps_avx(auVar277,auVar277,0xc9);
                  auVar198._0_4_ = auVar275._0_4_ * auVar197._0_4_;
                  auVar198._4_4_ = auVar275._4_4_ * auVar197._4_4_;
                  auVar198._8_4_ = auVar275._8_4_ * auVar197._8_4_;
                  auVar198._12_4_ = auVar275._12_4_ * auVar197._12_4_;
                  auVar216._0_4_ = auVar277._0_4_ * auVar190._0_4_;
                  auVar216._4_4_ = auVar277._4_4_ * auVar190._4_4_;
                  auVar216._8_4_ = auVar277._8_4_ * auVar190._8_4_;
                  auVar216._12_4_ = auVar277._12_4_ * auVar190._12_4_;
                  auVar2 = vsubps_avx(auVar216,auVar198);
                  auVar190 = vshufps_avx(auVar2,auVar2,0xc9);
                  auVar275 = vshufps_avx(auVar138,auVar138,0xc9);
                  auVar217._0_4_ = auVar275._0_4_ * auVar190._0_4_;
                  auVar217._4_4_ = auVar275._4_4_ * auVar190._4_4_;
                  auVar217._8_4_ = auVar275._8_4_ * auVar190._8_4_;
                  auVar217._12_4_ = auVar275._12_4_ * auVar190._12_4_;
                  auVar190 = vshufps_avx(auVar2,auVar2,0xd2);
                  auVar139._0_4_ = auVar138._0_4_ * auVar190._0_4_;
                  auVar139._4_4_ = auVar138._4_4_ * auVar190._4_4_;
                  auVar139._8_4_ = auVar138._8_4_ * auVar190._8_4_;
                  auVar139._12_4_ = auVar138._12_4_ * auVar190._12_4_;
                  auVar190 = vsubps_avx(auVar217,auVar139);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    uVar1 = vextractps_avx(auVar190,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar190,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar190._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar231;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = local_960;
                    *(uint *)(ray + k * 4 + 0x240) = uVar75;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar7 = context->user;
                    auStack_710 = vshufps_avx(auVar88,auVar88,0x55);
                    auStack_770 = vshufps_avx(auVar190,auVar190,0x55);
                    auStack_750 = vshufps_avx(auVar190,auVar190,0xaa);
                    auStack_730 = vshufps_avx(auVar190,auVar190,0);
                    local_780 = (RTCHitN  [16])auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = auStack_710;
                    local_700 = ZEXT832(0) << 0x20;
                    local_6e0 = local_620._0_8_;
                    uStack_6d8 = local_620._8_8_;
                    uStack_6d0 = local_620._16_8_;
                    uStack_6c8 = local_620._24_8_;
                    local_6c0 = local_600;
                    auVar94 = vcmpps_avx(local_600,local_600,0xf);
                    local_b08[1] = auVar94;
                    *local_b08 = auVar94;
                    local_6a0 = pRVar7->instID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    local_680 = pRVar7->instPrimID[0];
                    uStack_67c = local_680;
                    uStack_678 = local_680;
                    uStack_674 = local_680;
                    uStack_670 = local_680;
                    uStack_66c = local_680;
                    uStack_668 = local_680;
                    uStack_664 = local_680;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    local_c40 = *local_b10;
                    local_c30 = *local_b18;
                    local_bd0.valid = (int *)local_c40;
                    local_bd0.geometryUserPtr = pGVar6->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = local_780;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_bd0);
                      auVar285 = ZEXT3264(local_a20);
                      auVar353 = ZEXT3264(local_b80);
                      auVar339 = ZEXT3264(local_aa0);
                    }
                    auVar190 = vpcmpeqd_avx(local_c40,ZEXT816(0) << 0x40);
                    auVar275 = vpcmpeqd_avx(local_c30,ZEXT816(0) << 0x40);
                    auVar172._16_16_ = auVar275;
                    auVar172._0_16_ = auVar190;
                    auVar94 = _DAT_01f7b020 & ~auVar172;
                    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar94 >> 0x7f,0) != '\0') ||
                          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar94 >> 0xbf,0) != '\0') ||
                        (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar94[0x1f] < '\0') {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_bd0);
                        auVar285 = ZEXT3264(local_a20);
                        auVar353 = ZEXT3264(local_b80);
                        auVar339 = ZEXT3264(local_aa0);
                      }
                      auVar190 = vpcmpeqd_avx(local_c40,ZEXT816(0) << 0x40);
                      auVar275 = vpcmpeqd_avx(local_c30,ZEXT816(0) << 0x40);
                      auVar113._16_16_ = auVar275;
                      auVar113._0_16_ = auVar190;
                      auVar94 = _DAT_01f7b020 & ~auVar113;
                      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar94 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar94 >> 0x7f,0) != '\0') ||
                            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar94 >> 0xbf,0) != '\0') ||
                          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar94[0x1f] < '\0') {
                        auVar114._0_8_ = auVar190._0_8_ ^ 0xffffffffffffffff;
                        auVar114._8_4_ = auVar190._8_4_ ^ 0xffffffff;
                        auVar114._12_4_ = auVar190._12_4_ ^ 0xffffffff;
                        auVar114._16_4_ = auVar275._0_4_ ^ 0xffffffff;
                        auVar114._20_4_ = auVar275._4_4_ ^ 0xffffffff;
                        auVar114._24_4_ = auVar275._8_4_ ^ 0xffffffff;
                        auVar114._28_4_ = auVar275._12_4_ ^ 0xffffffff;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar94;
                        auVar94 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                           (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar94;
                        goto LAB_0098045b;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar229;
                  }
                }
              }
            }
LAB_0098045b:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar327._4_4_ = uVar1;
            auVar327._0_4_ = uVar1;
            auVar327._8_4_ = uVar1;
            auVar327._12_4_ = uVar1;
            auVar327._16_4_ = uVar1;
            auVar327._20_4_ = uVar1;
            auVar327._24_4_ = uVar1;
            auVar327._28_4_ = uVar1;
            auVar393 = ZEXT3264(auVar327);
            auVar94 = vcmpps_avx(_local_8c0,auVar327,2);
            auVar94 = vandps_avx(auVar94,local_520);
          }
          auVar94 = vandps_avx(local_7e0,local_7c0);
          auVar106 = vandps_avx(local_900,_local_8e0);
          auVar173._0_4_ = (float)local_940._0_4_ + local_4e0._0_4_;
          auVar173._4_4_ = (float)local_940._4_4_ + local_4e0._4_4_;
          auVar173._8_4_ = fStack_938 + local_4e0._8_4_;
          auVar173._12_4_ = fStack_934 + local_4e0._12_4_;
          auVar173._16_4_ = fStack_930 + local_4e0._16_4_;
          auVar173._20_4_ = fStack_92c + local_4e0._20_4_;
          auVar173._24_4_ = fStack_928 + local_4e0._24_4_;
          auVar173._28_4_ = fStack_924 + local_4e0._28_4_;
          auVar190 = vshufps_avx(auVar393._0_16_,auVar393._0_16_,0);
          auVar226._16_16_ = auVar190;
          auVar226._0_16_ = auVar190;
          auVar10 = vcmpps_avx(auVar173,auVar226,2);
          auVar94 = vandps_avx(auVar10,auVar94);
          auVar256._0_4_ = (float)local_940._0_4_ + local_4a0._0_4_;
          auVar256._4_4_ = (float)local_940._4_4_ + local_4a0._4_4_;
          auVar256._8_4_ = fStack_938 + local_4a0._8_4_;
          auVar256._12_4_ = fStack_934 + local_4a0._12_4_;
          auVar256._16_4_ = fStack_930 + local_4a0._16_4_;
          auVar256._20_4_ = fStack_92c + local_4a0._20_4_;
          auVar256._24_4_ = fStack_928 + local_4a0._24_4_;
          auVar256._28_4_ = fStack_924 + local_4a0._28_4_;
          auVar10 = vcmpps_avx(auVar256,auVar226,2);
          auVar106 = vandps_avx(auVar10,auVar106);
          auVar106 = vorps_avx(auVar94,auVar106);
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar80 * 0x60) = auVar106;
            auVar94 = vblendvps_avx(_local_4a0,_local_4e0,auVar94);
            *(undefined1 (*) [32])(auStack_160 + uVar80 * 0x60) = auVar94;
            uVar78 = vmovlps_avx(local_790);
            (&uStack_140)[uVar80 * 0xc] = uVar78;
            auStack_138[uVar80 * 0x18] = local_d64 + 1;
            uVar80 = (ulong)((int)uVar80 + 1);
          }
          auVar393 = ZEXT3264(local_9e0);
          fVar178 = (float)local_940._0_4_;
          fVar180 = (float)local_940._4_4_;
          fVar182 = fStack_938;
          fVar177 = fStack_934;
          fVar179 = fStack_930;
          fVar181 = fStack_92c;
          fVar183 = fStack_928;
          fVar273 = fStack_924;
          goto LAB_0097ee67;
        }
      }
      auVar339 = ZEXT3264(local_aa0);
      auVar393 = ZEXT3264(local_9e0);
      auVar353 = ZEXT3264(local_b80);
      auVar285 = ZEXT3264(local_a20);
    }
LAB_0097ee67:
    while( true ) {
      auVar280 = local_5c0;
      uVar82 = (uint)uVar80;
      if (uVar82 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar115._4_4_ = uVar1;
        auVar115._0_4_ = uVar1;
        auVar115._8_4_ = uVar1;
        auVar115._12_4_ = uVar1;
        auVar115._16_4_ = uVar1;
        auVar115._20_4_ = uVar1;
        auVar115._24_4_ = uVar1;
        auVar115._28_4_ = uVar1;
        auVar94 = vcmpps_avx(local_400,auVar115,2);
        uVar75 = vmovmskps_avx(auVar94);
        uVar75 = (uint)uVar81 & uVar75;
        goto LAB_0097dd4f;
      }
      uVar80 = (ulong)(uVar82 - 1);
      lVar77 = uVar80 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar77);
      auVar105._0_4_ = fVar178 + auVar94._0_4_;
      auVar105._4_4_ = fVar180 + auVar94._4_4_;
      auVar105._8_4_ = fVar182 + auVar94._8_4_;
      auVar105._12_4_ = fVar177 + auVar94._12_4_;
      auVar105._16_4_ = fVar179 + auVar94._16_4_;
      auVar105._20_4_ = fVar181 + auVar94._20_4_;
      auVar105._24_4_ = fVar183 + auVar94._24_4_;
      auVar105._28_4_ = fVar273 + auVar94._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar205._4_4_ = uVar1;
      auVar205._0_4_ = uVar1;
      auVar205._8_4_ = uVar1;
      auVar205._12_4_ = uVar1;
      auVar205._16_4_ = uVar1;
      auVar205._20_4_ = uVar1;
      auVar205._24_4_ = uVar1;
      auVar205._28_4_ = uVar1;
      auVar10 = vcmpps_avx(auVar105,auVar205,2);
      auVar106 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar77));
      _local_780 = auVar106;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar77) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar80 = (ulong)(uVar82 - 1);
    }
    auVar169._8_4_ = 0x7f800000;
    auVar169._0_8_ = 0x7f8000007f800000;
    auVar169._12_4_ = 0x7f800000;
    auVar169._16_4_ = 0x7f800000;
    auVar169._20_4_ = 0x7f800000;
    auVar169._24_4_ = 0x7f800000;
    auVar169._28_4_ = 0x7f800000;
    auVar94 = vblendvps_avx(auVar169,auVar94,auVar106);
    auVar10 = vshufps_avx(auVar94,auVar94,0xb1);
    auVar10 = vminps_avx(auVar94,auVar10);
    auVar11 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar11 = vperm2f128_avx(auVar10,auVar10,1);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar94 = vcmpps_avx(auVar94,auVar10,0);
    auVar10 = auVar106 & auVar94;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar106 = vandps_avx(auVar94,auVar106);
    }
    auVar129._8_8_ = 0;
    auVar129._0_8_ = (&uStack_140)[uVar80 * 0xc];
    local_d64 = auStack_138[uVar80 * 0x18];
    uVar79 = vmovmskps_avx(auVar106);
    uVar76 = 0;
    if (uVar79 != 0) {
      for (; (uVar79 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
      }
    }
    *(undefined4 *)(local_780 + (ulong)uVar76 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar77) = _local_780;
    uVar79 = uVar82 - 1;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar79 = uVar82;
    }
    auVar190 = vshufps_avx(auVar129,auVar129,0);
    auVar275 = vshufps_avx(auVar129,auVar129,0x55);
    auVar275 = vsubps_avx(auVar275,auVar190);
    local_4e0._4_4_ = auVar190._4_4_ + auVar275._4_4_ * 0.14285715;
    local_4e0._0_4_ = auVar190._0_4_ + auVar275._0_4_ * 0.0;
    fStack_4d8 = auVar190._8_4_ + auVar275._8_4_ * 0.2857143;
    fStack_4d4 = auVar190._12_4_ + auVar275._12_4_ * 0.42857146;
    fStack_4d0 = auVar190._0_4_ + auVar275._0_4_ * 0.5714286;
    fStack_4cc = auVar190._4_4_ + auVar275._4_4_ * 0.71428573;
    fStack_4c8 = auVar190._8_4_ + auVar275._8_4_ * 0.8571429;
    fStack_4c4 = auVar190._12_4_ + auVar275._12_4_;
    local_790._8_8_ = 0;
    local_790._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar76 * 4);
    uVar80 = (ulong)uVar79;
    auVar352 = auVar353._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }